

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void SPARSITY_PREPROC_CSR(int *colVals,int *rowPtrs,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  int k_1;
  long lVar34;
  double *pdVar35;
  int iVar36;
  double *pdVar37;
  double *pdVar38;
  long lVar39;
  ulong uVar40;
  int k;
  int iVar41;
  double *pdVar42;
  int iVar43;
  double *pdVar44;
  double *pdVar45;
  double *pdVar46;
  double *pdVar47;
  double *__s;
  double *pdVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  undefined1 auVar106 [16];
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  undefined4 uVar181;
  undefined4 uVar182;
  undefined4 uVar183;
  undefined4 uVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  undefined4 uVar245;
  undefined4 uVar246;
  undefined4 uVar247;
  undefined4 uVar248;
  undefined4 uVar249;
  undefined4 uVar250;
  undefined4 uVar251;
  undefined4 uVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  GpuArray<double,_21U> conc;
  Real h_RT [21];
  Real c_R [21];
  Real dcRdT [21];
  double local_1698;
  double local_1688;
  double local_1678;
  double local_1668;
  double dStack_1660;
  undefined8 local_1658;
  undefined8 local_1648;
  double local_1638;
  double local_1628;
  double local_1618;
  double local_1608;
  double local_15f8;
  double local_15e8;
  double local_15d8;
  double local_15c8;
  double adStack_15c0 [9];
  undefined4 local_1578;
  undefined4 uStack_1574;
  double dStack_1570;
  double dStack_1568;
  double local_1560;
  double dStack_1558;
  double local_1550;
  double dStack_1548;
  double local_1540;
  double local_1538;
  double dStack_1530;
  double local_1528;
  double local_1520;
  double local_1518;
  double local_1508 [17];
  undefined1 local_1480 [40];
  double local_1458;
  double local_1448;
  double local_1438;
  double local_1428;
  double local_1418;
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  double dStack_13f0;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  double local_13c8;
  double dStack_13c0;
  double dStack_13b8;
  double local_13b0;
  double dStack_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double local_1388;
  double local_1380;
  double local_1378;
  double local_1368;
  double dStack_1360;
  double local_1358;
  double dStack_1350;
  double local_1348;
  double dStack_1340;
  double local_1338;
  double dStack_1330;
  double local_1328;
  double dStack_1320;
  double local_1318;
  double dStack_1310;
  double local_1308;
  double dStack_1300;
  double local_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double local_12b8;
  double dStack_12b0;
  double local_12a0;
  double local_1298;
  undefined8 uStack_1290;
  double local_1288 [4];
  double local_1268;
  double local_1260;
  double local_1258;
  double local_1250;
  double local_1248;
  double local_1240;
  double local_1238;
  double dStack_1230;
  double local_1228;
  double local_1220;
  double local_1218;
  double local_1210;
  double local_1208;
  double local_1200;
  double local_11f8 [3];
  double adStack_11e0 [24];
  undefined1 local_1120 [16];
  double local_1110;
  double dStack_1108;
  double local_1100;
  double local_10f8;
  double dStack_10f0;
  double local_10e8;
  double local_10e0;
  double local_10d8;
  double dStack_10d0;
  double local_10c8;
  undefined1 local_10c0 [16];
  double local_10b0;
  double local_10a8;
  double local_10a0;
  double local_1098;
  double local_1078;
  double local_1070;
  double local_1068;
  double dStack_1060;
  double dStack_1058;
  double local_1050;
  double dStack_1048;
  double local_1040;
  double local_1038;
  double local_1030;
  double local_1028;
  double local_1020;
  double local_1018;
  double local_1010;
  double dStack_1008;
  double dStack_1000;
  double local_ff8;
  double local_ff0;
  double local_fc8;
  double local_fc0;
  double dStack_fb8;
  double local_fb0;
  double dStack_fa8;
  double local_fa0;
  double local_f98;
  double dStack_f90;
  double local_f88;
  double local_f80;
  double local_f78;
  double local_f70;
  double dStack_f68;
  double local_f60;
  double local_f58;
  double dStack_f50;
  double local_f40;
  double local_f38;
  double local_f18;
  double local_f10;
  double dStack_f08;
  double local_f00;
  double local_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double dStack_ed8;
  double local_ed0;
  double local_ec8;
  double local_ec0;
  double local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  double local_e98;
  double local_e90;
  double local_e88;
  double local_e68;
  double local_e60;
  double local_e58;
  double local_e50;
  double dStack_e48;
  double local_e40;
  double dStack_e38;
  double local_e30;
  double local_e20;
  double local_e18;
  double local_e10;
  double local_e08;
  double local_e00;
  double dStack_df8;
  double dStack_df0;
  double local_de8;
  double local_de0;
  double local_db8;
  double local_db0;
  double local_da8;
  double local_da0;
  double local_d98;
  double local_d90;
  double local_d88;
  double dStack_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d50;
  double local_d48;
  double local_d38;
  double local_d08;
  double local_d00;
  double local_cf8;
  double local_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd0;
  double local_cc8;
  double local_cc0;
  undefined1 local_cb8 [16];
  double local_ca8;
  double local_ca0;
  double local_c98;
  double local_c88;
  double local_c58;
  double local_c50;
  double dStack_c48;
  double local_c40;
  double dStack_c38;
  double local_c30;
  double local_c28;
  double local_c20;
  double dStack_c18;
  double local_c10;
  double local_c08;
  double local_c00;
  double local_bf0;
  double dStack_be8;
  double local_be0;
  double local_bd8;
  double dStack_bd0;
  double local_bc8;
  double local_ba8;
  double local_ba0;
  double dStack_b98;
  double local_b90;
  double local_b88;
  double local_b80;
  double local_b78;
  double local_b70;
  double local_b68;
  double local_b60;
  double local_b58;
  double local_b50;
  double local_b48;
  double local_b40;
  double local_b38;
  double local_b30;
  double local_b28;
  double local_b20;
  double local_b18;
  double local_af8;
  double local_af0;
  double dStack_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double dStack_aa0;
  double dStack_a98;
  double dStack_a90;
  double local_a88;
  double local_a80;
  double local_a78;
  double local_a70;
  double local_a68;
  double local_a48;
  double local_a40;
  double dStack_a38;
  double local_a30;
  double local_a28;
  double local_a18;
  double local_a10;
  double local_a08;
  double local_a00;
  double local_9f8;
  double local_9f0;
  double local_9e8;
  double local_9e0;
  double local_9d8;
  double local_9d0;
  double local_9c8;
  double local_9c0;
  double local_9b8;
  double local_998;
  double local_990;
  double local_988;
  double local_980;
  double local_978;
  double local_970;
  double local_968;
  double local_960;
  double local_958;
  double local_950;
  double local_948;
  double dStack_940;
  double dStack_938;
  double local_930;
  double local_928;
  double local_918;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  double local_8c0;
  double local_8b8;
  double dStack_8b0;
  double dStack_8a8;
  double local_8a0;
  double local_898;
  double local_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_860;
  double local_830;
  double local_828;
  double local_820;
  double local_818;
  double local_808;
  double local_7f0;
  double local_7c8;
  double local_7c0;
  double local_780;
  double local_778;
  double local_770;
  double local_758;
  double local_750;
  double local_748;
  double dStack_740;
  double local_720;
  double local_708;
  double local_700;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  double local_690;
  double local_688;
  double local_668;
  double local_658;
  double local_650;
  double local_648;
  double local_628;
  double local_620;
  double dStack_618;
  double local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  double local_5e0;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_570;
  double local_560;
  double local_548;
  double local_540;
  double local_538;
  double local_4c8;
  double local_4c0;
  double dStack_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_448;
  double local_440;
  double local_438;
  double local_418;
  undefined1 local_410 [16];
  double local_400;
  double dStack_3f8;
  double local_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double dStack_388;
  double local_370;
  double local_368;
  double dStack_360;
  double local_350;
  double local_348;
  int local_33c;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  undefined8 uStack_290;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double local_260;
  double local_258 [22];
  double local_1a8 [22];
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_d0 [2];
  double local_c0 [2];
  double local_b0 [2];
  double local_a0 [2];
  double local_90 [2];
  double local_80 [2];
  double local_70 [2];
  double local_60 [2];
  double adStack_50 [2];
  double adStack_40 [2];
  
  uStack_1290._4_4_ = NCELLS;
  local_33c = base;
  memset(adStack_15c0 + 1,0,0xa8);
  pdVar45 = &local_d8;
  local_278 = adStack_50;
  local_268 = local_1a8 + 0x11;
  local_270 = local_1a8 + 0x13;
  local_280 = adStack_40;
  lVar34 = 1;
  auVar106 = _DAT_0074fb30;
  do {
    if (SUB164(auVar106 ^ _DAT_0074fb40,4) == -0x80000000 &&
        SUB164(auVar106 ^ _DAT_0074fb40,0) < -0x7fffffeb) {
      adStack_15c0[lVar34] = 0.047619047619047616;
      adStack_15c0[lVar34 + 1] = 0.047619047619047616;
    }
    lVar39 = auVar106._8_8_;
    auVar106._0_8_ = auVar106._0_8_ + 2;
    auVar106._8_8_ = lVar39 + 2;
    lVar34 = lVar34 + 2;
  } while (lVar34 != 0x17);
  iVar36 = *consP;
  __s = local_1288;
  lVar34 = 0;
  memset(__s,0,0xf20);
  memset(local_1508,0,0xa8);
  dVar53 = adStack_15c0[8];
  dVar185 = adStack_15c0[2];
  dVar155 = 0.0;
  do {
    dVar155 = dVar155 + adStack_15c0[lVar34 + 1];
    lVar34 = lVar34 + 1;
  } while (lVar34 != 0x15);
  local_1368 = 2.9101473600491667;
  dStack_1360 = 19.482439934646393;
  local_1358 = 22.00757879476429;
  dStack_1350 = 3.2555381179699996;
  local_1348 = 6.1092103122075;
  dStack_1340 = -15.524086927680834;
  local_1338 = 5.3818731557687505;
  dStack_1330 = 35.602608086557915;
  local_1328 = 38.543891960460414;
  dStack_1320 = 17.114317783399166;
  local_1318 = 0.4349435637083328;
  dStack_1310 = -5.748131844745;
  local_1308 = -26.605086887896665;
  dStack_1300 = 7.7442483232375;
  local_12f8 = -3.2271354189666677;
  dStack_12f0 = 8.078776559375;
  local_12e8 = 12.395261584404166;
  dStack_12e0 = 18.914627724425003;
  local_12d8 = 3.874817692333335;
  dStack_12d0 = 3.0794231235708334;
  local_12c8 = 2.0030833333333335;
  local_15e8 = adStack_15c0[1];
  local_15f8 = dVar155 + adStack_15c0[1];
  local_1668 = adStack_15c0[6];
  local_1638 = dStack_1568;
  local_1628 = local_1560;
  local_1618 = dStack_1558;
  local_1648 = local_1528;
  local_15d8 = local_1528 + local_1528 +
               local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
  local_1678 = local_1518 * -0.30000000000000004 + local_15d8;
  local_1698 = adStack_15c0[2];
  local_1458 = adStack_15c0[2] * adStack_15c0[8];
  dVar49 = local_1678 * 1e-12;
  dVar50 = (dVar49 / 71955998.06277587) * 2.2543283025642333e+17;
  dVar120 = dVar50 + 1.0;
  local_1448 = -0.0005580285508678667 / dVar120;
  dVar51 = log10(dVar50);
  local_1438 = 1.0 / ((dVar51 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  local_1428 = (dVar51 + -0.09006792635084097) * local_1438;
  local_12b8 = 1.0 / (local_1428 * local_1428 + 1.0);
  dVar52 = pow(10.0,local_12b8 * -0.46258518455098363);
  dVar51 = dStack_1570;
  dVar156 = local_12b8 * -0.9251703691019673 * local_12b8 * local_1428 * local_1438;
  local_1438 = dVar156 * -1.3374831843797492 * local_1438;
  dVar52 = dVar52 * (dVar50 / dVar120);
  dVar50 = (local_1458 * 71955998.06277587 + dStack_1570 * -0.15021418125880825) * dVar52;
  dVar253 = (local_1458 * -38376.53230014713 + dStack_1570 * -0.0036222377521367456) * dVar52 +
            ((local_1428 * dVar156 * -1.27 + local_1438 * -0.67 + local_12b8) *
             -0.0001271297967317221 + local_1438 * -0.0005580285508678667 + local_1448) *
            2.302585092994046 * dVar50;
  dVar156 = local_1508[1] - dVar50;
  local_1508[1] = dVar156;
  local_1508[7] = local_1508[7] - dVar50;
  dVar283 = local_1508[9] + dVar50;
  local_1508[9] = dVar283;
  dVar292 = dVar52 * 71955998.06277587;
  dVar52 = dVar52 * 0.15021418125880825;
  dVar50 = (1.0 / dVar120 + local_1438) * (dVar50 / local_1678);
  if (iVar36 == 0) {
    local_1418 = dVar50 * 2.0;
    local_1410._8_8_ = dVar50;
    local_1410._0_8_ = dVar53 * dVar292 + dVar50;
    local_1400._8_8_ = dVar50;
    local_1400._0_8_ = dVar50;
    dStack_13f0 = dVar50 * 6.0;
    local_13e8._8_8_ = dVar292 * dVar185 + dVar50;
    local_13e8._0_8_ = dVar50;
    local_13d8._8_8_ = dVar50 - dVar52;
    local_13d8._0_8_ = dVar50;
    auVar13._8_4_ = SUB84(dVar50 * 1.5,0);
    auVar13._0_8_ = local_1418;
    auVar13._12_4_ = (int)((ulong)(dVar50 * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar13._8_8_;
    dStack_13b8 = local_1418;
    dStack_13a0 = dVar50;
    dStack_1398 = dVar50;
    local_13b0 = dVar50;
    dStack_13a8 = dVar50;
    dStack_1390 = dVar50;
    local_1388 = dVar50 * 3.0;
    local_1380 = dVar50;
    local_1378 = dVar50 * 0.7;
    pdVar35 = &local_1240;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-8] = pdVar35[-8] - dVar53;
      pdVar35[-2] = pdVar35[-2] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar50;
    local_1250 = local_1250 - dVar50;
    local_1240 = local_1240 + dVar50;
    dVar53 = dVar53 * dVar292;
    adStack_11e0[2] = adStack_11e0[2] - dVar53;
    adStack_11e0[8] = adStack_11e0[8] - dVar53;
    adStack_11e0[10] = dVar53 + adStack_11e0[10];
    dVar53 = dVar50 * 5.0;
    local_f10 = local_f10 - dVar53;
    local_ee0 = local_ee0 - dVar53;
    local_ed0 = dVar53 + local_ed0;
    dVar185 = dVar185 * dVar292;
    local_db0 = local_db0 - dVar185;
    dStack_d80 = dStack_d80 - dVar185;
    local_d70 = dVar185 + local_d70;
    local_c50 = local_c50 + dVar52;
    local_c20 = local_c20 + dVar52;
    local_c10 = local_c10 - dVar52;
    local_ba0 = local_ba0 - dVar50;
    local_b70 = local_b70 - dVar50;
    local_b60 = local_b60 + dVar50;
    dVar53 = dVar50 * 0.5;
    local_af0 = local_af0 - dVar53;
    local_ac0 = local_ac0 - dVar53;
    local_ab0 = dVar53 + local_ab0;
    local_a40 = local_a40 - dVar50;
    local_a10 = local_a10 - dVar50;
    local_a00 = local_a00 + dVar50;
    dVar53 = dVar50 + dVar50;
    local_620 = local_620 - dVar53;
    local_5f0 = local_5f0 - dVar53;
    local_5e0 = dVar53 + local_5e0;
    dVar50 = dVar50 * -0.30000000000000004;
    local_4c0 = local_4c0 - dVar50;
    local_490 = local_490 - dVar50;
    local_480 = dVar50 + local_480;
    local_1698 = adStack_15c0[2];
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15d8 = local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
    local_1678 = local_1518 * -0.30000000000000004 + local_15d8;
    dVar49 = local_1678 * 1e-12;
  }
  local_410._0_8_ = (double)local_410._0_8_ - dVar253;
  dStack_3e0 = dStack_3e0 - dVar253;
  local_3d0 = dVar253 + local_3d0;
  local_1438 = (dVar49 / 111446030.23051862) * 8.322101603299873e+17;
  dVar53 = log10(local_1438);
  local_1448 = 1.0 / ((dVar53 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_1458 = (dVar53 + -0.1863137764834265) * local_1448;
  local_1428 = 1.0 / (local_1458 * local_1458 + 1.0);
  dVar120 = pow(10.0,local_1428 * -0.31893466196503506);
  dVar52 = dStack_1360;
  dVar50 = local_1550;
  dVar292 = local_1438 + 1.0;
  dVar53 = local_1428 * -0.6378693239300701 * local_1428 * local_1458 * local_1448;
  dVar185 = dVar53 * -1.1550470206955945 * local_1448;
  dVar120 = (local_1438 / dVar292) * dVar120;
  dVar186 = (local_1698 * dVar51 * 111446030.23051862 + local_1638 * -5.675915683847628) * dVar120;
  dVar253 = (local_1698 * dVar51 * -37261.015183856354 +
            (((local_1318 - (dStack_1320 + dStack_1360)) + 1.0) * -0.0006666666666666666 +
            -0.0003343413408874632) * -5.675915683847628 * local_1638) * dVar120 +
            ((local_1458 * dVar53 * -1.27 + dVar185 * -0.67 + local_1428) * -0.00011772029828908056
             + dVar185 * -0.000995959489983554 + -0.000995959489983554 / dVar292) *
            2.302585092994046 * dVar186;
  dVar156 = dVar156 - dVar186;
  local_1508[1] = dVar156;
  local_1508[9] = dVar283 - dVar186;
  local_1508[10] = local_1508[10] + dVar186;
  dVar53 = (1.0 / dVar292 + dVar185) * (dVar186 / local_1678);
  dVar185 = dVar120 * 111446030.23051862;
  if (iVar36 == 0) {
    local_1418 = dVar53 * 2.0;
    local_1410._8_8_ = dVar53;
    local_1410._0_8_ = dVar51 * dVar185 + dVar53;
    local_1400._8_8_ = dVar53;
    local_1400._0_8_ = dVar53;
    dStack_13f0 = dVar53 * 6.0;
    local_13e8._8_8_ = dVar53;
    local_13e8._0_8_ = dVar53;
    local_13d8._8_8_ = dVar185 * local_1698 + dVar53;
    local_13d8._0_8_ = dVar53;
    local_13c8 = (dVar53 + dVar53) - dVar120 * 5.675915683847628;
    auVar12._8_4_ = SUB84(local_1418,0);
    auVar12._0_8_ = dVar53 * 1.5;
    auVar12._12_4_ = (int)((ulong)local_1418 >> 0x20);
    dStack_13c0 = dVar53 * 1.5;
    dStack_13b8 = auVar12._8_8_;
    dStack_13a0 = dVar53;
    dStack_1398 = dVar53;
    local_13b0 = dVar53;
    dStack_13a8 = dVar53;
    dStack_1390 = dVar53;
    local_1388 = dVar53 * 3.0;
    local_1380 = dVar53;
    local_1378 = dVar53 * 0.7;
    pdVar35 = &local_1238;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-9] = pdVar35[-9] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar53;
    local_1240 = local_1240 - dVar53;
    local_1238 = local_1238 + dVar53;
    dVar51 = dVar51 * dVar185;
    adStack_11e0[2] = adStack_11e0[2] - dVar51;
    adStack_11e0[10] = adStack_11e0[10] - dVar51;
    adStack_11e0[0xb] = dVar51 + adStack_11e0[0xb];
    dVar49 = dVar53 * 5.0;
    local_f10 = local_f10 - dVar49;
    local_ed0 = local_ed0 - dVar49;
    local_ec8 = dVar49 + local_ec8;
    local_1698 = local_1698 * dVar185;
    local_c50 = local_c50 - local_1698;
    local_c10 = local_c10 - local_1698;
    local_c08 = local_1698 + local_c08;
    dVar185 = dVar53 - dVar120 * 5.675915683847628;
    local_ba0 = local_ba0 - dVar185;
    local_b60 = local_b60 - dVar185;
    local_b58 = dVar185 + local_b58;
    dVar185 = dVar53 * 0.5;
    local_af0 = local_af0 - dVar185;
    local_ab0 = local_ab0 - dVar185;
    local_aa8 = dVar185 + local_aa8;
    local_a40 = local_a40 - dVar53;
    local_a00 = local_a00 - dVar53;
    local_9f8 = local_9f8 + dVar53;
    dVar185 = dVar53 + dVar53;
    local_620 = local_620 - dVar185;
    local_5e0 = local_5e0 - dVar185;
    local_5d8 = dVar185 + local_5d8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_4c0 = local_4c0 - dVar53;
    local_480 = local_480 - dVar53;
    local_478 = dVar53 + local_478;
    local_1698 = adStack_15c0[2];
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15d8 = local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
    local_1678 = local_1518 * -0.30000000000000004 + local_15d8;
    dVar49 = local_1678 * 1e-12;
  }
  local_1608 = dStack_1360;
  local_410._0_8_ = (double)local_410._0_8_ - dVar253;
  local_3d0 = local_3d0 - dVar253;
  local_3c8 = dVar253 + local_3c8;
  dVar253 = (dVar49 / 39795255.79748703) * 5756549223630996.0;
  dVar53 = log10(dVar253);
  local_1448 = 1.0 / ((dVar53 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1458 = (dVar53 + -0.1786261669350975) * local_1448;
  local_1438 = 1.0 / (local_1458 * local_1458 + 1.0);
  dVar49 = pow(10.0,local_1438 * -0.33040870606701866);
  dVar120 = local_12f8;
  dVar51 = dStack_1548;
  dVar283 = dVar253 + 1.0;
  dVar53 = local_1438 * -0.6608174121340373 * local_1438 * local_1458 * local_1448;
  dVar185 = dVar53 * -1.1696190567051137 * local_1448;
  dVar49 = (dVar253 / dVar283) * dVar49;
  dVar253 = (local_1698 * dVar50 * 39795255.79748703 + dStack_1548 * -367.47982351959547) * dVar49;
  dVar52 = (local_1698 * dVar50 * 10420.408369112773 +
           (((local_12f8 - (dStack_1300 + dVar52)) + 1.0) * -0.0006666666666666666 +
           0.0002618505186181212) * -367.47982351959547 * dStack_1548) * dVar49 +
           ((local_1458 * dVar53 * -1.27 + dVar185 * -0.67 + local_1438) * -0.0001220771720522275 +
            dVar185 * -0.0007194001075784557 + -0.0007194001075784557 / dVar283) * 2.302585092994046
           * dVar253;
  dVar156 = dVar156 - dVar253;
  local_1508[1] = dVar156;
  local_1508[0xd] = local_1508[0xd] - dVar253;
  dVar292 = local_1508[0xe] + dVar253;
  dVar53 = (1.0 / dVar283 + dVar185) * (dVar253 / local_1678);
  local_1508[0xe] = dVar292;
  dVar185 = dVar49 * 39795255.79748703;
  dVar49 = dVar49 * 367.47982351959547;
  if (iVar36 == 0) {
    local_1418 = dVar53 * 2.0;
    local_1410._8_8_ = dVar53;
    local_1410._0_8_ = dVar50 * dVar185 + dVar53;
    local_1400._8_8_ = dVar53;
    local_1400._0_8_ = dVar53;
    dStack_13f0 = dVar53 * 6.0;
    local_13d8._8_8_ = dVar53;
    local_13d8._0_8_ = dVar53;
    local_13e8._8_8_ = dVar53;
    local_13e8._0_8_ = dVar53;
    auVar11._8_4_ = SUB84(dVar53 * 1.5,0);
    auVar11._0_8_ = local_1418;
    auVar11._12_4_ = (int)((ulong)(dVar53 * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar11._8_8_;
    dStack_13b8 = local_1418;
    local_13b0 = dVar185 * local_1698 + dVar53;
    dStack_13a8 = dVar53 - dVar49;
    dStack_13a0 = dVar53;
    dStack_1398 = dVar53;
    dStack_1390 = dVar53;
    local_1388 = dVar53 * 3.0;
    local_1380 = dVar53;
    local_1378 = dVar53 * 0.7;
    pdVar35 = &local_1218;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0xd] = pdVar35[-0xd] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar53;
    local_1220 = local_1220 - dVar53;
    local_1218 = local_1218 + dVar53;
    dVar50 = dVar50 * dVar185;
    adStack_11e0[2] = adStack_11e0[2] - dVar50;
    adStack_11e0[0xe] = adStack_11e0[0xe] - dVar50;
    adStack_11e0[0xf] = dVar50 + adStack_11e0[0xf];
    dVar50 = dVar53 * 5.0;
    local_f10 = local_f10 - dVar50;
    local_eb0 = local_eb0 - dVar50;
    local_ea8 = dVar50 + local_ea8;
    local_ba0 = local_ba0 - dVar53;
    local_b40 = local_b40 - dVar53;
    local_b38 = local_b38 + dVar53;
    dVar50 = dVar53 * 0.5;
    local_af0 = local_af0 - dVar50;
    dStack_a90 = dStack_a90 - dVar50;
    local_a88 = dVar50 + local_a88;
    local_a40 = local_a40 - dVar53;
    local_9e0 = local_9e0 - dVar53;
    local_9d8 = local_9d8 + dVar53;
    local_1698 = local_1698 * dVar185;
    local_990 = local_990 - local_1698;
    local_930 = local_930 - local_1698;
    local_928 = local_1698 + local_928;
    local_8e0 = local_8e0 + dVar49;
    local_880 = local_880 + dVar49;
    local_878 = local_878 - dVar49;
    dVar185 = dVar53 + dVar53;
    local_620 = local_620 - dVar185;
    local_5c0 = local_5c0 - dVar185;
    local_5b8 = dVar185 + local_5b8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_4c0 = local_4c0 - dVar53;
    local_460 = local_460 - dVar53;
    local_458 = dVar53 + local_458;
    local_1698 = adStack_15c0[2];
    local_1608 = dStack_1360;
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15d8 = local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
  }
  local_410._0_8_ = (double)local_410._0_8_ - dVar52;
  dStack_3b0 = dStack_3b0 - dVar52;
  dStack_3a8 = dVar52 + dStack_3a8;
  local_1438 = ((local_15d8 * 1e-12) / 6244953.487472275) * 193693058799875.4;
  dVar53 = log10(local_1438);
  local_1448 = 1.0 / ((dVar53 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1458 = (dVar53 + -0.09427787237484897) * local_1448;
  local_1428 = 1.0 / (local_1458 * local_1458 + 1.0);
  dVar185 = pow(10.0,local_1428 * -0.4563016830226135);
  dVar53 = local_1428 * -0.912603366045227 * local_1428 * local_1458 * local_1448;
  dVar49 = local_1438 + 1.0;
  local_1448 = dVar53 * -1.3295031374387192 * local_1448;
  dVar185 = (local_1438 / dVar49) * dVar185;
  dVar52 = (local_1698 * dVar51 * 6244953.487472275 + local_1540 * -27501071940.071716) * dVar185;
  dVar50 = (local_1698 * dVar51 * 5521.547321046288 +
           (((dStack_12f0 - (dVar120 + local_1608)) + 1.0) * -0.0006666666666666666 +
           0.0008841614804854543) * -27501071940.071716 * local_1540) * dVar185 +
           ((local_1458 * dVar53 * -1.27 + local_1448 * -0.67 + local_1428) * -8.975305961941277e-05
            + local_1448 * -0.001233681740997213 + -0.001233681740997213 / dVar49) *
           2.302585092994046 * dVar52;
  dVar156 = dVar156 - dVar52;
  local_1508[1] = dVar156;
  local_1508[0xe] = dVar292 - dVar52;
  local_1508[0xf] = local_1508[0xf] + dVar52;
  dVar53 = (1.0 / dVar49 + local_1448) * (dVar52 / local_15d8);
  dVar49 = dVar185 * 6244953.487472275;
  dVar185 = dVar185 * 27501071940.071716;
  if (iVar36 == 0) {
    local_1418 = dVar53 * 2.0;
    local_1410._8_8_ = dVar53;
    local_1410._0_8_ = dVar51 * dVar49 + dVar53;
    local_1400._8_8_ = dVar53;
    local_1400._0_8_ = dVar53;
    dStack_13f0 = dVar53 * 6.0;
    local_13d8._8_8_ = dVar53;
    local_13d8._0_8_ = dVar53;
    local_13e8._8_8_ = dVar53;
    local_13e8._0_8_ = dVar53;
    auVar10._8_4_ = SUB84(dVar53 * 1.5,0);
    auVar10._0_8_ = local_1418;
    auVar10._12_4_ = (int)((ulong)(dVar53 * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar10._8_8_;
    dStack_13b8 = local_1418;
    local_13b0 = dVar53;
    dStack_13a8 = dVar49 * local_1698 + dVar53;
    dStack_13a0 = dVar53 - dVar185;
    dStack_1398 = dVar53;
    dStack_1390 = dVar53;
    local_1388 = dVar53 * 3.0;
    local_1380 = dVar53;
    local_1378 = dVar53;
    pdVar35 = &local_1210;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0xe] = pdVar35[-0xe] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar53;
    local_1218 = local_1218 - dVar53;
    local_1210 = local_1210 + dVar53;
    dVar51 = dVar51 * dVar49;
    adStack_11e0[2] = adStack_11e0[2] - dVar51;
    adStack_11e0[0xf] = adStack_11e0[0xf] - dVar51;
    adStack_11e0[0x10] = dVar51 + adStack_11e0[0x10];
    dVar51 = dVar53 * 5.0;
    local_f10 = local_f10 - dVar51;
    local_ea8 = local_ea8 - dVar51;
    local_ea0 = dVar51 + local_ea0;
    local_ba0 = local_ba0 - dVar53;
    local_b38 = local_b38 - dVar53;
    local_b30 = local_b30 + dVar53;
    dVar51 = dVar53 * 0.5;
    local_af0 = local_af0 - dVar51;
    local_a88 = local_a88 - dVar51;
    local_a80 = dVar51 + local_a80;
    local_a40 = local_a40 - dVar53;
    local_9d8 = local_9d8 - dVar53;
    local_9d0 = local_9d0 + dVar53;
    local_1698 = local_1698 * dVar49;
    local_8e0 = local_8e0 - local_1698;
    local_878 = local_878 - local_1698;
    local_870 = local_1698 + local_870;
    local_830 = local_830 + dVar185;
    local_7c8 = local_7c8 + dVar185;
    local_7c0 = local_7c0 - dVar185;
    dVar53 = dVar53 + dVar53;
    local_620 = local_620 - dVar53;
    local_5b8 = local_5b8 - dVar53;
    local_5b0 = dVar53 + local_5b0;
    local_1698 = adStack_15c0[2];
    local_1608 = dStack_1360;
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15d8 = local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
  }
  local_410._0_8_ = (double)local_410._0_8_ - dVar50;
  local_3a0 = dVar50 + local_3a0;
  dStack_3a8 = dStack_3a8 - dVar50;
  local_1448 = local_1538;
  local_15c8 = local_1518;
  local_1678 = local_1518 * -0.30000000000000004 + local_15d8;
  dVar50 = local_1678 * 1e-12;
  local_1458 = (dVar50 / 16225653.552515732) * 7.275514395950915e+16;
  dVar53 = log10(local_1458);
  dVar185 = 1.0 / ((dVar53 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1438 = (dVar53 + -0.015265883794403325) * dVar185;
  local_1428 = 1.0 / (local_1438 * local_1438 + 1.0);
  dVar49 = pow(10.0,local_1428 * -0.5742300241874577);
  dVar52 = local_1458 + 1.0;
  dVar53 = local_1428 * -1.1484600483749154 * local_1428 * local_1438 * dVar185;
  dVar185 = dVar53 * -1.4792721307180714 * dVar185;
  dVar49 = (local_1458 / dVar52) * dVar49;
  dVar120 = (local_1698 * local_1448 * 16225653.552515732 + dStack_1530 * -67434469.58138922) *
            dVar49;
  dVar51 = (local_1698 * local_1448 * 11515.557849353894 +
           (((dStack_12e0 - (local_12e8 + local_1608)) + 1.0) * -0.0006666666666666666 +
           0.0007097130363398179) * -67434469.58138922 * dStack_1530) * dVar49 +
           ((local_1438 * dVar53 * -1.27 + dVar185 * -0.67 + local_1428) * -0.00018029438599527205 +
            dVar185 * -0.0018374389917122033 + -0.0018374389917122033 / dVar52) * 2.302585092994046
           * dVar120;
  dVar156 = dVar156 - dVar120;
  local_1508[1] = dVar156;
  local_1508[0x10] = local_1508[0x10] - dVar120;
  local_1458 = (double)local_1480._0_8_ + dVar120;
  dVar53 = (1.0 / dVar52 + dVar185) * (dVar120 / local_1678);
  local_1480._0_8_ = local_1458;
  dVar185 = dVar49 * 16225653.552515732;
  dVar49 = dVar49 * 67434469.58138922;
  if (iVar36 == 0) {
    local_1418 = dVar53 * 2.0;
    local_1410._8_8_ = dVar53;
    local_1410._0_8_ = local_1448 * dVar185 + dVar53;
    local_1400._8_8_ = dVar53;
    local_1400._0_8_ = dVar53;
    dStack_13f0 = dVar53 * 6.0;
    local_13d8._8_8_ = dVar53;
    local_13d8._0_8_ = dVar53;
    local_13e8._8_8_ = dVar53;
    local_13e8._0_8_ = dVar53;
    auVar9._8_4_ = SUB84(dVar53 * 1.5,0);
    auVar9._0_8_ = local_1418;
    auVar9._12_4_ = (int)((ulong)(dVar53 * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar9._8_8_;
    dStack_13b8 = local_1418;
    local_13b0 = dVar53;
    dStack_13a8 = dVar53;
    dStack_13a0 = dVar53;
    dStack_1398 = dVar185 * local_1698 + dVar53;
    dStack_1390 = dVar53 - dVar49;
    local_1388 = dVar53 * 3.0;
    local_1380 = dVar53;
    local_1378 = dVar53 * 0.7;
    pdVar35 = &local_1200;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0x10] = pdVar35[-0x10] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar53;
    local_1208 = local_1208 - dVar53;
    local_1200 = local_1200 + dVar53;
    local_1448 = local_1448 * dVar185;
    adStack_11e0[2] = adStack_11e0[2] - local_1448;
    adStack_11e0[0x11] = adStack_11e0[0x11] - local_1448;
    adStack_11e0[0x12] = local_1448 + adStack_11e0[0x12];
    dVar50 = dVar53 * 5.0;
    local_f10 = local_f10 - dVar50;
    local_e98 = local_e98 - dVar50;
    local_e90 = dVar50 + local_e90;
    local_ba0 = local_ba0 - dVar53;
    local_b28 = local_b28 - dVar53;
    local_b20 = local_b20 + dVar53;
    dVar50 = dVar53 * 0.5;
    local_af0 = local_af0 - dVar50;
    local_a78 = local_a78 - dVar50;
    local_a70 = dVar50 + local_a70;
    local_a40 = local_a40 - dVar53;
    local_9c8 = local_9c8 - dVar53;
    local_9c0 = local_9c0 + dVar53;
    local_1698 = local_1698 * dVar185;
    local_780 = local_780 - local_1698;
    local_708 = local_708 - local_1698;
    local_700 = local_1698 + local_700;
    local_6d0 = local_6d0 + dVar49;
    local_658 = local_658 + dVar49;
    local_650 = local_650 - dVar49;
    dVar185 = dVar53 + dVar53;
    local_620 = local_620 - dVar185;
    local_5a8 = local_5a8 - dVar185;
    local_5a0 = dVar185 + local_5a0;
    dVar53 = dVar53 * -0.30000000000000004;
    local_4c0 = local_4c0 - dVar53;
    local_448 = local_448 - dVar53;
    local_440 = dVar53 + local_440;
    local_1698 = adStack_15c0[2];
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15c8 = local_1518;
    local_1678 = local_1518 * -0.30000000000000004 +
                 local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
    dVar50 = local_1678 * 1e-12;
    local_1608 = dStack_1360;
  }
  local_1448 = dStack_1530;
  local_1608 = dStack_12e0 + local_1608;
  local_410._0_8_ = (double)local_410._0_8_ - dVar51;
  local_398 = local_398 - dVar51;
  local_390 = dVar51 + local_390;
  local_1428 = (dVar50 / 219941642.44158944) * 6.888873607161395e+17;
  dVar53 = log10(local_1428);
  dVar185 = 1.0 / ((dVar53 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  local_1438 = (dVar53 + -0.1601631500988638) * dVar185;
  local_12b8 = 1.0 / (local_1438 * local_1438 + 1.0);
  dVar49 = pow(10.0,local_12b8 * -0.35796544761363613);
  dVar52 = local_1428 + 1.0;
  dVar53 = local_12b8 * -0.7159308952272723 * local_12b8 * local_1438 * dVar185;
  dVar185 = dVar53 * -1.2046161184693178 * dVar185;
  dVar49 = (local_1428 / dVar52) * dVar49;
  dVar120 = (local_1698 * local_1448 * 219941642.44158944 + local_1648 * -123.84112181745292) *
            dVar49;
  dVar51 = (local_1698 * local_1448 * -67440.72224696395 +
           (((local_12d8 - local_1608) + 1.0) * -0.0006666666666666666 + -0.0003066300746793522) *
           -123.84112181745292 * local_1648) * dVar49 +
           ((local_1438 * dVar53 * -1.27 + dVar185 * -0.67 + local_12b8) * -0.00016037027791424038 +
            dVar185 * -0.001267383041404717 + -0.001267383041404717 / dVar52) * 2.302585092994046 *
           dVar120;
  local_1508[1] = dVar156 - dVar120;
  local_1480._0_8_ = local_1458 - dVar120;
  local_1480._8_8_ = (double)local_1480._8_8_ + dVar120;
  dVar53 = (1.0 / dVar52 + dVar185) * (dVar120 / local_1678);
  dVar185 = dVar49 * 219941642.44158944;
  if (iVar36 == 0) {
    local_1418 = dVar53 * 2.0;
    local_1410._8_8_ = dVar53;
    local_1410._0_8_ = local_1448 * dVar185 + dVar53;
    local_1400._8_8_ = dVar53;
    local_1400._0_8_ = dVar53;
    dStack_13f0 = dVar53 * 6.0;
    local_13d8._8_8_ = dVar53;
    local_13d8._0_8_ = dVar53;
    local_13e8._8_8_ = dVar53;
    local_13e8._0_8_ = dVar53;
    auVar8._8_4_ = SUB84(dVar53 * 1.5,0);
    auVar8._0_8_ = local_1418;
    auVar8._12_4_ = (int)((ulong)(dVar53 * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar8._8_8_;
    dStack_13b8 = local_1418;
    dStack_13a0 = dVar53;
    dStack_1398 = dVar53;
    local_13b0 = dVar53;
    dStack_13a8 = dVar53;
    dStack_1390 = local_1698 * dVar185 + dVar53;
    local_1388 = dVar53 * 3.0 - dVar49 * 123.84112181745292;
    local_1380 = dVar53;
    local_1378 = dVar53 * 0.7;
    pdVar35 = local_11f8;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0x11] = pdVar35[-0x11] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - dVar53;
    local_1200 = local_1200 - dVar53;
    local_11f8[0] = local_11f8[0] + dVar53;
    local_1448 = local_1448 * dVar185;
    adStack_11e0[2] = adStack_11e0[2] - local_1448;
    adStack_11e0[0x12] = adStack_11e0[0x12] - local_1448;
    adStack_11e0[0x13] = local_1448 + adStack_11e0[0x13];
    dVar50 = dVar53 * 5.0;
    local_f10 = local_f10 - dVar50;
    local_e90 = local_e90 - dVar50;
    local_e88 = dVar50 + local_e88;
    local_ba0 = local_ba0 - dVar53;
    local_b20 = local_b20 - dVar53;
    local_b18 = local_b18 + dVar53;
    dVar50 = dVar53 * 0.5;
    local_af0 = local_af0 - dVar50;
    local_a70 = local_a70 - dVar50;
    local_a68 = dVar50 + local_a68;
    local_a40 = local_a40 - dVar53;
    local_9c0 = local_9c0 - dVar53;
    local_9b8 = local_9b8 + dVar53;
    local_1698 = local_1698 * dVar185;
    local_6d0 = local_6d0 - local_1698;
    local_650 = local_650 - local_1698;
    local_648 = local_1698 + local_648;
    dVar185 = (dVar53 + dVar53) - dVar49 * 123.84112181745292;
    local_620 = local_620 - dVar185;
    local_5a0 = local_5a0 - dVar185;
    local_598 = dVar185 + local_598;
    dVar53 = dVar53 * -0.30000000000000004;
    local_4c0 = local_4c0 - dVar53;
    local_440 = local_440 - dVar53;
    local_438 = dVar53 + local_438;
    local_15e8 = adStack_15c0[1];
    local_15f8 = dVar155 + adStack_15c0[1];
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15c8 = local_1518;
    local_1678 = local_1518 * -0.30000000000000004 +
                 local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
    dVar50 = local_1678 * 1e-12;
  }
  local_410._0_8_ = (double)local_410._0_8_ - dVar51;
  local_390 = local_390 - dVar51;
  dStack_388 = dVar51 + dStack_388;
  dVar52 = (dVar50 / 6.312363615626772e-06) * 35752.450724543516;
  dVar53 = log10(dVar52);
  dVar185 = 1.0 / ((dVar53 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  dVar120 = (dVar53 + -0.09697718965666909) * dVar185;
  dVar156 = 1.0 / (dVar120 * dVar120 + 1.0);
  dVar49 = pow(10.0,dVar156 * -0.45227285125870287);
  dVar51 = dStack_1570;
  dVar253 = dVar52 + 1.0;
  dVar53 = dVar156 * -0.9045457025174057 * dVar156 * dVar120 * dVar185;
  dVar185 = dVar53 * -1.3243865210985526 * dVar185;
  dVar49 = (dVar52 / dVar253) * dVar49;
  dVar283 = (local_15e8 * local_1628 * 6.312363615626772e-06 + dStack_1548 * -115.13226896846228) *
            dVar49;
  dVar52 = (local_15e8 * local_1628 * 1.1868939967403452e-07 +
           (((local_12f8 - (local_1368 + dStack_1310)) + 1.0) * -0.0006666666666666666 +
           0.01880268737691365) * -115.13226896846228 * dStack_1548) * dVar49 +
           ((dVar120 * dVar53 * -1.27 + dVar185 * -0.67 + dVar156) * -0.0002754907583934973 +
            dVar185 * -0.0009631147670810994 + -0.0009631147670810994 / dVar253) * 2.302585092994046
           * dVar283;
  local_1508[0] = local_1508[0] - dVar283;
  local_1508[0xb] = local_1508[0xb] - dVar283;
  local_1508[0xe] = local_1508[0xe] + dVar283;
  dVar120 = dVar49 * 6.312363615626772e-06;
  dVar49 = dVar49 * 115.13226896846228;
  dVar53 = (1.0 / dVar253 + dVar185) * (dVar283 / local_1678);
  dVar185 = dVar53 + dVar53;
  if (iVar36 == 0) {
    local_1418 = dVar120 * local_1628 + dVar185;
    uVar181 = SUB84(dVar53,0);
    uVar183 = (undefined4)((ulong)dVar53 >> 0x20);
    local_1400._8_4_ = uVar181;
    local_1400._0_8_ = dVar53;
    local_1400._12_4_ = uVar183;
    local_1410._8_4_ = uVar181;
    local_1410._0_8_ = dVar53;
    local_1410._12_4_ = uVar183;
    dStack_13f0 = dVar53 * 6.0;
    local_13d8._8_4_ = uVar181;
    local_13d8._0_8_ = dVar53;
    local_13d8._12_4_ = uVar183;
    local_13e8._8_4_ = uVar181;
    local_13e8._0_8_ = dVar53;
    local_13e8._12_4_ = uVar183;
    local_13c8 = dVar185;
    dStack_13c0 = dVar53 * 1.5 + dVar120 * local_15e8;
    dStack_13b8 = dVar185;
    local_13b0 = dVar53;
    dStack_13a8 = dVar53 - dVar49;
    dStack_13a0 = dVar53;
    dStack_1398 = dVar53;
    dStack_1390 = dVar53;
    local_1388 = dVar53 * 3.0;
    local_1380 = dVar53;
    local_1378 = dVar53 * 0.7;
    pdVar35 = &local_1218;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0xe] = pdVar35[-0xe] - dVar53;
      pdVar35[-3] = pdVar35[-3] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    dVar50 = dVar120 * local_1628 + dVar53;
    local_1288[0] = local_1288[0] - dVar50;
    dStack_1230 = dStack_1230 - dVar50;
    local_1218 = dVar50 + local_1218;
    dVar50 = dVar53 * 5.0;
    local_f18 = local_f18 - dVar50;
    local_ec0 = local_ec0 - dVar50;
    local_ea8 = dVar50 + local_ea8;
    local_ba8 = local_ba8 - dVar53;
    local_b50 = local_b50 - dVar53;
    local_b38 = local_b38 + dVar53;
    dVar50 = dVar53 * 0.5 + dVar120 * local_15e8;
    local_af8 = local_af8 - dVar50;
    dStack_aa0 = dStack_aa0 - dVar50;
    local_a88 = dVar50 + local_a88;
    local_a48 = local_a48 - dVar53;
    local_9f0 = local_9f0 - dVar53;
    local_9d8 = local_9d8 + dVar53;
    local_8e8 = local_8e8 + dVar49;
    local_890 = local_890 + dVar49;
    local_878 = local_878 - dVar49;
    local_628 = local_628 - dVar185;
    local_5d0 = local_5d0 - dVar185;
    local_5b8 = dVar185 + local_5b8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_4c8 = local_4c8 - dVar53;
    local_470 = local_470 - dVar53;
    local_458 = dVar53 + local_458;
    local_15f8 = adStack_15c0[1] + dVar155;
    local_1668 = adStack_15c0[6];
    local_1638 = dStack_1568;
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_1648 = local_1528;
    local_15c8 = local_1518;
    local_1678 = local_1518 * -0.30000000000000004 +
                 local_1528 + local_1528 +
                 local_1560 * 0.5 + adStack_15c0[6] * 5.0 + local_15f8 + dStack_1568 + dStack_1558;
    dVar50 = local_1678 * 1e-12;
  }
  local_418 = local_418 - dVar52;
  dStack_3c0 = dStack_3c0 - dVar52;
  dStack_3a8 = dVar52 + dStack_3a8;
  dVar50 = (dVar50 / 14295380.788738592) * 4.2554035761159823e+18;
  dVar53 = log10(dVar50);
  dVar185 = 1.0 / ((dVar53 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  dVar49 = (dVar53 + 0.12973051019251233) * dVar185;
  dVar52 = 1.0 / (dVar49 * dVar49 + 1.0);
  dVar120 = pow(10.0,dVar52 * -0.7906425525261378);
  dVar156 = dVar50 + 1.0;
  dVar53 = dVar52 * -1.5812851050522756 * dVar52 * dVar49 * dVar185;
  dVar185 = dVar53 * -1.7541160417081951 * dVar185;
  dVar120 = (dVar50 / dVar156) * dVar120;
  dVar50 = (dVar51 * dVar51 * 14295380.788738592 + local_1648 * -4338.16492800087) * dVar120;
  dVar53 = (dVar51 * dVar51 * -7262.089447255807 +
           (((local_12d8 - (dStack_1320 + dStack_1320)) + 1.0) * -0.0006666666666666666 +
           -0.0005080025187560327) * -4338.16492800087 * local_1648) * dVar120 +
           ((dVar49 * dVar53 * -1.27 + dVar185 * -0.67 + dVar52) * -0.00010911464158415095 +
            dVar185 * -0.001974975711261012 + -0.001974975711261012 / dVar156) * 2.302585092994046 *
           dVar50;
  local_1508[9] = local_1508[9] - (dVar50 + dVar50);
  local_1480._8_8_ = (double)local_1480._8_8_ + dVar50;
  dVar49 = dVar120 * 14295380.788738592;
  local_1400._8_8_ = (1.0 / dVar156 + dVar185) * (dVar50 / local_1678);
  if (iVar36 == 0) {
    local_1418 = (double)local_1400._8_8_ * 2.0;
    local_1400._0_8_ = local_1400._8_8_;
    local_1410._8_8_ = local_1400._8_8_;
    local_1410._0_8_ = local_1400._8_8_;
    dStack_13f0 = (double)local_1400._8_8_ * 6.0;
    local_13e8._8_8_ = local_1400._8_8_;
    local_13e8._0_8_ = local_1400._8_8_;
    local_13d8._8_8_ = (dVar49 + dVar49) * dVar51 + (double)local_1400._8_8_;
    local_13d8._0_8_ = local_1400._8_8_;
    auVar7._8_4_ = SUB84((double)local_1400._8_8_ * 1.5,0);
    auVar7._0_8_ = local_1418;
    auVar7._12_4_ = (int)((ulong)((double)local_1400._8_8_ * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar7._8_8_;
    dStack_13b8 = local_1418;
    dStack_13a0 = (double)local_1400._8_8_;
    dStack_1398 = (double)local_1400._8_8_;
    local_13b0 = (double)local_1400._8_8_;
    dStack_13a8 = (double)local_1400._8_8_;
    dStack_1390 = (double)local_1400._8_8_;
    local_1388 = (double)local_1400._8_8_ * 3.0 - dVar120 * 4338.16492800087;
    local_1380 = (double)local_1400._8_8_;
    local_1378 = (double)local_1400._8_8_ * 0.7;
    pdVar35 = &local_1240;
    lVar34 = 0;
    do {
      dVar185 = *(double *)(local_1410 + lVar34 * 8 + -8);
      *pdVar35 = *pdVar35 - (dVar185 + dVar185);
      pdVar35[9] = dVar185 + pdVar35[9];
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    dVar50 = (double)local_1400._8_8_ * -2.0;
    local_1240 = local_1240 + dVar50;
    local_11f8[0] = local_11f8[0] + (double)local_1400._8_8_;
    dVar185 = (double)local_1400._8_8_ * 5.0;
    local_ed0 = local_ed0 - (dVar185 + dVar185);
    local_e88 = dVar185 + local_e88;
    dVar51 = (dVar49 + dVar49) * dVar51;
    local_c10 = local_c10 - (dVar51 + dVar51);
    local_bc8 = dVar51 + local_bc8;
    local_b60 = local_b60 + dVar50;
    local_b18 = local_b18 + (double)local_1400._8_8_;
    dVar185 = (double)local_1400._8_8_ * 0.5;
    local_ab0 = local_ab0 - (dVar185 + dVar185);
    local_a68 = dVar185 + local_a68;
    local_a00 = dVar50 + local_a00;
    local_9b8 = local_9b8 + (double)local_1400._8_8_;
    dVar185 = ((double)local_1400._8_8_ + (double)local_1400._8_8_) - dVar120 * 4338.16492800087;
    local_5e0 = local_5e0 - (dVar185 + dVar185);
    local_598 = dVar185 + local_598;
    local_1400._8_8_ = (double)local_1400._8_8_ * -0.30000000000000004;
    local_480 = local_480 - ((double)local_1400._8_8_ + (double)local_1400._8_8_);
    local_438 = (double)local_1400._8_8_ + local_438;
  }
  local_3d0 = local_3d0 - (dVar53 + dVar53);
  dStack_388 = dVar53 + dStack_388;
  local_1400._0_8_ =
       adStack_15c0[3] * adStack_15c0[2] * 333.3333333333333 +
       adStack_15c0[5] * -7.276980120178465e-07;
  dVar185 = local_1678 * (double)local_1400._0_8_;
  dVar53 = (adStack_15c0[3] * adStack_15c0[2] * -0.2222222222222222 +
           (((local_1348 - (dStack_1360 + local_1358)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -7.276980120178465e-07 * adStack_15c0[5]) * local_1678;
  local_1508[1] = local_1508[1] - dVar185;
  local_1508[2] = local_1508[2] - dVar185;
  local_1508[4] = dVar185 + local_1508[4];
  dVar185 = local_1678 * 333.3333333333333;
  local_1678 = local_1678 * 7.276980120178465e-07;
  if (iVar36 == 0) {
    local_1418 = (double)local_1400._0_8_ * 2.0;
    local_1410._8_8_ = dVar185 * adStack_15c0[2] + (double)local_1400._0_8_;
    local_1410._0_8_ = dVar185 * adStack_15c0[3] + (double)local_1400._0_8_;
    local_1400._8_8_ = (double)local_1400._0_8_ - local_1678;
    dStack_13f0 = (double)local_1400._0_8_ * 6.0;
    local_13d8._8_8_ = local_1400._0_8_;
    local_13d8._0_8_ = local_1400._0_8_;
    local_13e8._8_8_ = local_1400._0_8_;
    local_13e8._0_8_ = local_1400._0_8_;
    auVar20._8_4_ = SUB84((double)local_1400._0_8_ * 1.5,0);
    auVar20._0_8_ = local_1418;
    auVar20._12_4_ = (int)((ulong)((double)local_1400._0_8_ * 1.5) >> 0x20);
    local_13c8 = local_1418;
    dStack_13c0 = auVar20._8_8_;
    dStack_13b8 = local_1418;
    dStack_13a0 = (double)local_1400._0_8_;
    dStack_1398 = (double)local_1400._0_8_;
    local_13b0 = (double)local_1400._0_8_;
    dStack_13a8 = (double)local_1400._0_8_;
    dStack_1390 = (double)local_1400._0_8_;
    local_1388 = (double)local_1400._0_8_ * 3.0;
    local_1380 = (double)local_1400._0_8_;
    local_1378 = (double)local_1400._0_8_ * 0.7;
    pdVar35 = local_1288 + 1;
    lVar34 = 0;
    do {
      dVar185 = *(double *)(local_1410 + lVar34 * 8 + -8);
      *pdVar35 = *pdVar35 - dVar185;
      pdVar35[1] = pdVar35[1] - dVar185;
      pdVar35[3] = dVar185 + pdVar35[3];
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[1] = local_1288[1] - (double)local_1400._0_8_;
    local_1288[2] = local_1288[2] - (double)local_1400._0_8_;
    local_1268 = local_1268 + (double)local_1400._0_8_;
    dVar50 = dVar185 * adStack_15c0[3];
    adStack_11e0[2] = adStack_11e0[2] - dVar50;
    adStack_11e0[3] = adStack_11e0[3] - dVar50;
    adStack_11e0[5] = dVar50 + adStack_11e0[5];
    dVar185 = adStack_15c0[2] * dVar185;
    auVar14._8_4_ = SUB84((double)local_1120._8_8_ - dVar185,0);
    auVar14._0_8_ = (double)local_1120._0_8_ - dVar185;
    auVar14._12_4_ = (int)((ulong)((double)local_1120._8_8_ - dVar185) >> 0x20);
    local_1120 = auVar14;
    dStack_1108 = dVar185 + dStack_1108;
    dStack_fb8 = local_1678 + dStack_fb8;
    local_fc0 = local_1678 + local_fc0;
    dStack_fa8 = dStack_fa8 - local_1678;
    dVar185 = (double)local_1400._0_8_ * 5.0;
    local_f10 = local_f10 - dVar185;
    dStack_f08 = dStack_f08 - dVar185;
    local_ef8 = dVar185 + local_ef8;
    local_ba0 = local_ba0 - (double)local_1400._0_8_;
    dStack_b98 = dStack_b98 - (double)local_1400._0_8_;
    local_b88 = local_b88 + (double)local_1400._0_8_;
    dVar185 = (double)local_1400._0_8_ * 0.5;
    local_af0 = local_af0 - dVar185;
    dStack_ae8 = dStack_ae8 - dVar185;
    local_ad8 = dVar185 + local_ad8;
    local_a40 = local_a40 - (double)local_1400._0_8_;
    dStack_a38 = dStack_a38 - (double)local_1400._0_8_;
    local_a28 = local_a28 + (double)local_1400._0_8_;
    dVar185 = (double)local_1400._0_8_ + (double)local_1400._0_8_;
    local_620 = local_620 - dVar185;
    dStack_618 = dStack_618 - dVar185;
    local_1400._0_8_ = (double)local_1400._0_8_ * -0.30000000000000004;
    local_608 = dVar185 + local_608;
    local_4c0 = local_4c0 - (double)local_1400._0_8_;
    dStack_4b8 = dStack_4b8 - (double)local_1400._0_8_;
    local_4a8 = (double)local_1400._0_8_ + local_4a8;
    local_15f8 = adStack_15c0[1] + dVar155;
    local_1648 = local_1528;
    local_1668 = adStack_15c0[6];
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_15c8 = local_1518;
    local_1638 = dStack_1568;
  }
  auVar1._8_4_ = SUB84((double)local_410._8_8_ - dVar53,0);
  auVar1._0_8_ = (double)local_410._0_8_ - dVar53;
  auVar1._12_4_ = (int)((ulong)((double)local_410._8_8_ - dVar53) >> 0x20);
  local_410 = auVar1;
  dStack_3f8 = dVar53 + dStack_3f8;
  dVar50 = local_15c8 * -0.5 +
           local_1648 + local_1648 +
           local_1618 * 2.5 +
           local_1628 * 0.5 + local_1668 * 5.0 + adStack_15c0[4] * 5.0 + local_15f8 + local_1638;
  local_1410._0_8_ =
       local_1628 * adStack_15c0[3] * 220.0432490668822 + local_1618 * -3.54614235835121e-08;
  dVar185 = dVar50 * (double)local_1410._0_8_;
  dVar53 = (local_1628 * adStack_15c0[3] * 0.14763924017103203 +
           (((local_1308 - (local_1358 + dStack_1310)) + 1.0) * -0.0006666666666666666 +
           0.0006709555544062933) * -3.54614235835121e-08 * local_1618) * dVar50;
  local_1508[2] = local_1508[2] - dVar185;
  local_1508[0xb] = local_1508[0xb] - dVar185;
  local_1508[0xc] = dVar185 + local_1508[0xc];
  dVar185 = dVar50 * 220.0432490668822;
  local_1418 = (double)local_1410._0_8_ + (double)local_1410._0_8_;
  dVar49 = dVar185 * local_1628;
  if (iVar36 == 0) {
    local_1410._8_8_ = dVar49 + (double)local_1410._0_8_;
    local_1400._8_8_ = local_1410._0_8_;
    local_1400._0_8_ = (double)local_1410._0_8_ * 6.0;
    dStack_13f0 = (double)local_1410._0_8_ * 6.0;
    local_13d8._8_8_ = local_1410._0_8_;
    local_13d8._0_8_ = local_1410._0_8_;
    local_13e8._8_8_ = local_1410._0_8_;
    local_13e8._0_8_ = local_1410._0_8_;
    local_13c8 = local_1418;
    dStack_13c0 = (double)local_1410._0_8_ * 1.5 + dVar185 * adStack_15c0[3];
    dStack_13b8 = (double)local_1410._0_8_ * 3.5 + -(dVar50 * 3.54614235835121e-08);
    dStack_13a0 = (double)local_1410._0_8_;
    dStack_1398 = (double)local_1410._0_8_;
    local_13b0 = (double)local_1410._0_8_;
    dStack_13a8 = (double)local_1410._0_8_;
    dStack_1390 = (double)local_1410._0_8_;
    local_1388 = (double)local_1410._0_8_ * 3.0;
    local_1380 = (double)local_1410._0_8_;
    local_1378 = (double)local_1410._0_8_ * 0.5;
    pdVar35 = &local_1228;
    lVar34 = 0;
    do {
      dVar185 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-10] = pdVar35[-10] - dVar185;
      pdVar35[-1] = pdVar35[-1] - dVar185;
      *pdVar35 = dVar185 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
  }
  else {
    local_1288[2] = local_1288[2] - (double)local_1410._0_8_;
    dStack_1230 = dStack_1230 - (double)local_1410._0_8_;
    local_1228 = local_1228 + (double)local_1410._0_8_;
    local_1120._8_8_ = (double)local_1120._8_8_ - dVar49;
    dStack_10d0 = dStack_10d0 - dVar49;
    local_10c8 = dVar49 + local_10c8;
    dVar49 = (double)local_1410._0_8_ * 5.0;
    local_1068 = local_1068 - dVar49;
    local_1020 = local_1020 - dVar49;
    local_1018 = local_1018 + dVar49;
    dStack_f08 = dStack_f08 - dVar49;
    local_ec0 = local_ec0 - dVar49;
    local_eb8 = dVar49 + local_eb8;
    dStack_b98 = dStack_b98 - (double)local_1410._0_8_;
    local_b50 = local_b50 - (double)local_1410._0_8_;
    local_b48 = local_b48 + (double)local_1410._0_8_;
    dVar185 = (double)local_1410._0_8_ * 0.5 + dVar185 * adStack_15c0[3];
    dStack_ae8 = dStack_ae8 - dVar185;
    dStack_aa0 = dStack_aa0 - dVar185;
    dStack_a98 = dVar185 + dStack_a98;
    dVar185 = (double)local_1410._0_8_ * 2.5 - dVar50 * 3.54614235835121e-08;
    dStack_a38 = dStack_a38 - dVar185;
    local_9f0 = local_9f0 - dVar185;
    local_9e8 = dVar185 + local_9e8;
    dStack_618 = dStack_618 - local_1418;
    local_5d0 = local_5d0 - local_1418;
    local_5c8 = local_1418 + local_5c8;
    local_1410._0_8_ = (double)local_1410._0_8_ * -0.5;
    dStack_4b8 = dStack_4b8 - (double)local_1410._0_8_;
    local_470 = local_470 - (double)local_1410._0_8_;
    local_468 = (double)local_1410._0_8_ + local_468;
    local_1648 = local_1528;
    local_1668 = adStack_15c0[6];
    local_1628 = local_1560;
    local_1618 = dStack_1558;
    local_15c8 = local_1518;
  }
  local_410._8_8_ = (double)local_410._8_8_ - dVar53;
  dStack_3c0 = dStack_3c0 - dVar53;
  dStack_3b8 = dVar53 + dStack_3b8;
  local_15c8 = ((local_1648 * 0.5 +
                local_1618 * 0.5 + local_1628 * -0.25 + ((dVar155 - adStack_15c0[4]) - local_1668))
               - local_1520) - local_15c8;
  local_1418 = adStack_15c0[4] * adStack_15c0[2] * 5196.603105918946 +
               adStack_15c0[7] * -515.2276090538855;
  dVar53 = local_15c8 * local_1418;
  local_1508[1] = local_1508[1] - dVar53;
  local_1508[3] = local_1508[3] - dVar53;
  local_1508[6] = dVar53 + local_1508[6];
  dVar50 = (adStack_15c0[4] * adStack_15c0[2] * -2.979385780726863 +
           (((local_1338 - (dStack_1360 + dStack_1350)) + 1.0) * -0.0006666666666666666 +
           -0.0005733333333333334) * -515.2276090538855 * adStack_15c0[7]) * local_15c8;
  dVar53 = local_15c8 * 5196.603105918946;
  local_15c8 = local_15c8 * 515.2276090538855;
  dVar185 = dVar53 * adStack_15c0[4];
  if (iVar36 == 0) {
    local_1410._8_8_ = local_1418;
    local_1410._0_8_ = dVar185 + local_1418;
    local_1400._8_8_ = local_1418;
    local_1400._0_8_ = dVar53 * adStack_15c0[2];
    local_13c8 = local_1418;
    local_13e8._8_8_ = local_1418;
    local_13e8._0_8_ = local_1418 - local_15c8;
    local_13d8._8_8_ = local_1418;
    local_13d8._0_8_ = local_1418;
    local_1388 = local_1418 * 1.5;
    auVar6._8_4_ = SUB84(local_1388,0);
    auVar6._0_8_ = local_1418 * 0.75;
    auVar6._12_4_ = (int)((ulong)local_1388 >> 0x20);
    dStack_13c0 = local_1418 * 0.75;
    dStack_13b8 = auVar6._8_8_;
    dStack_13a0 = local_1418;
    dStack_1398 = local_1418;
    local_13b0 = local_1418;
    dStack_13a8 = local_1418;
    dStack_1390 = local_1418;
    pdVar35 = local_1288 + 1;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      *pdVar35 = *pdVar35 - dVar53;
      pdVar35[2] = pdVar35[2] - dVar53;
      pdVar35[5] = dVar53 + pdVar35[5];
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
    local_1698 = local_e60;
    local_1688 = local_e50;
    local_1618 = dStack_e38;
  }
  else {
    adStack_11e0[2] = adStack_11e0[2] - dVar185;
    adStack_11e0[4] = adStack_11e0[4] - dVar185;
    adStack_11e0[7] = dVar185 + adStack_11e0[7];
    dVar53 = dVar53 * adStack_15c0[2] - local_1418;
    local_1070 = local_1070 - dVar53;
    dStack_1060 = dStack_1060 - dVar53;
    dStack_1048 = dVar53 + dStack_1048;
    local_f10 = local_f10 + local_1418;
    local_f00 = local_f00 + local_1418;
    local_ee8 = local_ee8 - local_1418;
    local_1698 = local_e60 + local_15c8;
    local_1688 = local_e50 + local_15c8;
    local_1618 = dStack_e38 - local_15c8;
    dVar53 = local_1418 * -0.25;
    local_af0 = local_af0 - dVar53;
    local_ae0 = local_ae0 - dVar53;
    local_ac8 = dVar53 + local_ac8;
    dVar53 = local_1418 * 0.5;
    local_a40 = local_a40 - dVar53;
    local_a30 = local_a30 - dVar53;
    local_a18 = local_a18 + dVar53;
    local_620 = local_620 - dVar53;
    local_610 = local_610 - dVar53;
    local_5f8 = dVar53 + local_5f8;
    local_570 = local_570 + local_1418;
    local_560 = local_560 + local_1418;
    local_548 = local_548 - local_1418;
    local_4c0 = local_4c0 + local_1418;
    local_4b0 = local_4b0 + local_1418;
    local_498 = local_498 - local_1418;
    local_1668 = adStack_15c0[6];
  }
  local_1678 = adStack_15c0[4] * adStack_15c0[2];
  dVar53 = adStack_15c0[2] * adStack_15c0[4] * adStack_15c0[4];
  dVar292 = dVar53 * 1033.3424938946343 + adStack_15c0[4] * adStack_15c0[7] * -102.45280842339088;
  dVar283 = dVar53 * -1.1848993929991807 +
            ((((dStack_1350 + local_1338) - (dStack_1350 + dStack_1350 + dStack_1360)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -102.45280842339088 *
            adStack_15c0[4] * adStack_15c0[7];
  dVar120 = adStack_15c0[4] * adStack_15c0[4] * 1033.3424938946343;
  dVar315 = (adStack_15c0[2] * 1033.3424938946343 + adStack_15c0[2] * 1033.3424938946343) *
            adStack_15c0[4] + adStack_15c0[7] * -102.45280842339088;
  dVar271 = adStack_15c0[4] * -102.45280842339088;
  dVar185 = local_1678 * local_1668 * 36172.079901627476 +
            adStack_15c0[7] * local_1668 * -3586.3532123502373;
  dVar305 = local_1678 * local_1668 * -18.327187150157922 +
            ((((dStack_1340 + local_1338) - (dStack_1360 + dStack_1350 + dStack_1340)) + 1.0) *
             -0.0006666666666666666 + -0.0005066666666666667) * -3586.3532123502373 *
            adStack_15c0[7] * local_1668;
  dVar293 = adStack_15c0[4] * 36172.079901627476 * adStack_15c0[6];
  dVar284 = adStack_15c0[6] * adStack_15c0[2] * 36172.079901627476;
  dVar53 = adStack_15c0[2] * 36172.079901627476 * adStack_15c0[4] +
           adStack_15c0[7] * -3586.3532123502373;
  local_f10 = local_f10 - dVar53;
  local_f00 = local_f00 - dVar53;
  local_ee8 = dVar53 + local_ee8;
  dVar253 = adStack_15c0[6] * -3586.3532123502373;
  dVar53 = adStack_15c0[4] * adStack_15c0[2] * local_1520;
  dVar186 = dVar53 * 1291.6781173682928 + adStack_15c0[7] * local_1520 * -128.06601052923858;
  dVar254 = dVar53 * -1.4811242412489758 +
            ((((dStack_12d0 + local_1338) - (dStack_1360 + dStack_1350 + dStack_12d0)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            adStack_15c0[7] * local_1520;
  dVar49 = local_1520 * adStack_15c0[2] * 1291.6781173682928;
  dVar51 = adStack_15c0[4] * 1291.6781173682928 * local_1520;
  dVar52 = local_1520 * -128.06601052923858;
  dVar53 = adStack_15c0[2] * 1291.6781173682928 * adStack_15c0[4] +
           adStack_15c0[7] * -128.06601052923858;
  local_570 = local_570 - dVar53;
  local_560 = local_560 - dVar53;
  local_548 = dVar53 + local_548;
  dVar53 = adStack_15c0[4] * adStack_15c0[2] * local_1518;
  dVar221 = dVar53 * 2014.7679457577242 + adStack_15c0[7] * local_1518 * -199.75819787137542;
  dVar156 = dVar53 * -1.0745429044041197 +
            ((((local_12c8 + local_1338) - (dStack_1360 + dStack_1350 + local_12c8)) + 1.0) *
             -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
            adStack_15c0[7] * local_1518;
  local_1508[1] = (((local_1508[1] - dVar292) - dVar185) - dVar186) - dVar221;
  local_1508[3] = (((local_1508[3] - dVar292) - dVar185) - dVar186) - dVar221;
  local_1508[6] = dVar221 + dVar186 + dVar185 + dVar292 + local_1508[6];
  dVar53 = adStack_15c0[4] * 2014.7679457577242 * local_1518;
  adStack_11e0[2] = (((adStack_11e0[2] - dVar120) - dVar293) - dVar51) - dVar53;
  adStack_11e0[4] = (((adStack_11e0[4] - dVar120) - dVar293) - dVar51) - dVar53;
  adStack_11e0[7] = dVar53 + dVar51 + dVar293 + dVar120 + adStack_11e0[7];
  dVar53 = local_1518 * adStack_15c0[2] * 2014.7679457577242;
  local_1070 = (((local_1070 - dVar315) - dVar284) - dVar49) - dVar53;
  dStack_1060 = (((dStack_1060 - dVar315) - dVar284) - dVar49) - dVar53;
  dStack_1048 = dVar53 + dVar49 + dVar284 + dVar315 + dStack_1048;
  dVar53 = local_1518 * -199.75819787137542;
  local_e60 = (((local_1698 - dVar271) - dVar253) - dVar52) - dVar53;
  local_e50 = (((local_1688 - dVar271) - dVar253) - dVar52) - dVar53;
  dStack_e38 = dVar53 + dVar52 + dVar253 + dVar271 + local_1618;
  dVar53 = adStack_15c0[2] * 2014.7679457577242 * adStack_15c0[4] +
           adStack_15c0[7] * -199.75819787137542;
  local_4c0 = local_4c0 - dVar53;
  local_4b0 = local_4b0 - dVar53;
  local_498 = dVar53 + local_498;
  local_410._0_8_ = (((((double)local_410._0_8_ - dVar50) - dVar283) - dVar305) - dVar254) - dVar156
  ;
  local_400 = ((((local_400 - dVar50) - dVar283) - dVar305) - dVar254) - dVar156;
  local_3e8 = dVar156 + dVar254 + dVar305 + dVar283 + dVar50 + local_3e8;
  dVar51 = local_1518 * -0.37 +
           local_1528 + local_1528 +
           ((((dVar155 - adStack_15c0[1]) - adStack_15c0[6]) + dStack_1568) - dStack_1558);
  dVar52 = adStack_15c0[2] * adStack_15c0[2];
  dVar185 = dStack_1360 + dStack_1360;
  local_1410._8_8_ = dVar52 * 666.6666666666666 + adStack_15c0[1] * -1.6792101947629015e-06;
  dVar50 = (double)local_1410._8_8_ * dVar51;
  dVar49 = (dVar52 * -0.4444444444444444 +
           (((local_1368 - dVar185) + 1.0) * -0.0006666666666666666 + -0.0006666666666666666) *
           -1.6792101947629015e-06 * adStack_15c0[1]) * dVar51;
  dVar53 = dVar51 * 666.6666666666666 + dVar51 * 666.6666666666666;
  if (iVar36 == 0) {
    pdVar35 = &local_1418;
    local_1418 = dVar51 * -1.6792101947629015e-06;
    local_1410._0_8_ = dVar53 * adStack_15c0[2] + (double)local_1410._8_8_;
    local_1400._8_8_ = local_1410._8_8_;
    local_1400._0_8_ = local_1410._8_8_;
    local_13d8._8_8_ = local_1410._8_8_;
    local_13d8._0_8_ = local_1410._8_8_;
    local_13e8._8_8_ = local_1410._8_8_;
    local_13e8._0_8_ = local_1410._8_8_;
    local_13c8 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    dStack_13c0 = (double)local_1410._8_8_;
    dStack_13a0 = (double)local_1410._8_8_;
    dStack_1398 = (double)local_1410._8_8_;
    local_13b0 = (double)local_1410._8_8_;
    dStack_13a8 = (double)local_1410._8_8_;
    dStack_1390 = (double)local_1410._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_ * 0.63;
    lVar34 = 1;
    do {
      dVar53 = *pdVar35;
      (&uStack_1290)[lVar34] = (double)(&uStack_1290)[lVar34] + dVar53;
      local_1288[lVar34] = local_1288[lVar34] - (dVar53 + dVar53);
      pdVar35 = pdVar35 + 1;
      lVar34 = lVar34 + 0x16;
    } while (lVar34 != 0x1cf);
    local_1648 = local_1288[0];
    local_15f8 = adStack_11e0[1];
    local_15e8 = local_f18;
    local_1698 = local_f10;
  }
  else {
    dVar51 = dVar51 * -1.6792101947629015e-06 - (double)local_1410._8_8_;
    local_1648 = local_1288[0] + dVar51;
    local_1288[1] = local_1288[1] - (dVar51 + dVar51);
    dVar53 = dVar53 * adStack_15c0[2];
    local_15f8 = adStack_11e0[1] + dVar53;
    adStack_11e0[2] = adStack_11e0[2] - (dVar53 + dVar53);
    local_15e8 = local_f18 - (double)local_1410._8_8_;
    dVar53 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    local_1698 = local_f10 + dVar53;
    local_ba8 = local_ba8 + (double)local_1410._8_8_;
    local_ba0 = local_ba0 - dVar53;
    local_a48 = local_a48 - (double)local_1410._8_8_;
    local_a40 = local_a40 + dVar53;
    local_628 = local_628 + dVar53;
    local_620 = local_620 - (dVar53 + dVar53);
    local_1410._8_8_ = (double)local_1410._8_8_ * -0.37;
    local_4c8 = local_4c8 + (double)local_1410._8_8_;
    local_4c0 = local_4c0 - ((double)local_1410._8_8_ + (double)local_1410._8_8_);
  }
  dVar253 = adStack_15c0[1] * dVar52 * 1118.3757819574057 +
            adStack_15c0[1] * adStack_15c0[1] * -2.8169820219582113e-06;
  dVar120 = adStack_15c0[1] * dVar52 * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((local_1368 + local_1368) - (dVar185 + local_1368)) + 1.0) * 0.0006666666666666666) *
            -2.8169820219582113e-06 * adStack_15c0[1] * adStack_15c0[1];
  dVar53 = dVar52 * 1118.3757819574057 + adStack_15c0[1] * -5.633964043916423e-06;
  dVar186 = (adStack_15c0[1] * 1118.3757819574057 + adStack_15c0[1] * 1118.3757819574057) *
            adStack_15c0[2];
  dVar283 = dVar52 * adStack_15c0[6] * 6427.427351557215 +
            adStack_15c0[1] * adStack_15c0[6] * -1.618950230224919e-05;
  dVar221 = dVar52 * adStack_15c0[6] * -5.356189459631012 +
            (-0.0008333333333333333 -
            (((dStack_1340 + local_1368) - (dVar185 + dStack_1340)) + 1.0) * 0.0006666666666666666)
            * -1.618950230224919e-05 * adStack_15c0[1] * adStack_15c0[6];
  dVar292 = adStack_15c0[6] * -1.618950230224919e-05;
  dVar156 = adStack_15c0[2] * 12854.85470311443 * adStack_15c0[6];
  dVar51 = dVar52 * 6427.427351557215 + adStack_15c0[1] * -1.618950230224919e-05;
  local_f18 = local_15e8 + dVar51;
  local_f10 = local_1698 - (dVar51 + dVar51);
  dVar51 = dVar52 * dStack_1558 * 244.44444444444443 +
           adStack_15c0[1] * dStack_1558 * -6.157104047463972e-07;
  dVar254 = dVar52 * dStack_1558 * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((local_1308 + local_1368) - (dVar185 + local_1308)) + 1.0) * 0.0006666666666666666) *
            -6.157104047463972e-07 * adStack_15c0[1] * dStack_1558;
  local_1508[0] = local_1508[0] + dVar50 + dVar253 + dVar283 + dVar51;
  dVar52 = adStack_15c0[2] * 488.88888888888886 * dStack_1558;
  dVar185 = dStack_1558 * -6.157104047463972e-07;
  local_1288[0] = local_1648 + dVar53 + dVar292 + dVar185;
  local_1288[1] = ((local_1288[1] - (dVar53 + dVar53)) - (dVar292 + dVar292)) - (dVar185 + dVar185);
  adStack_11e0[1] = local_15f8 + dVar186 + dVar156 + dVar52;
  adStack_11e0[2] =
       ((adStack_11e0[2] - (dVar186 + dVar186)) - (dVar156 + dVar156)) - (dVar52 + dVar52);
  dVar53 = adStack_15c0[2] * adStack_15c0[2] * 244.44444444444443 +
           adStack_15c0[1] * -6.157104047463972e-07;
  local_a48 = local_a48 + dVar53;
  local_a40 = local_a40 - (dVar53 + dVar53);
  local_418 = local_418 + dVar49 + dVar120 + dVar221 + dVar254;
  local_410._0_8_ =
       ((((double)local_410._0_8_ - (dVar49 + dVar49)) - (dVar120 + dVar120)) - (dVar221 + dVar221))
       - (dVar254 + dVar254);
  dVar185 = local_1518 * -0.62 +
            local_1528 + local_1528 +
            adStack_15c0[6] * 2.65 + adStack_15c0[1] * -0.27 + dVar155 + dStack_1568;
  local_1410._8_8_ =
       adStack_15c0[2] * adStack_15c0[5] * 9777.777777777777 +
       adStack_15c0[6] * -7.029234294042697e-07;
  dVar53 = dVar185 * (double)local_1410._8_8_;
  local_1508[1] =
       ((((local_1508[1] - (dVar50 + dVar50)) - (dVar253 + dVar253)) - (dVar283 + dVar283)) -
       (dVar51 + dVar51)) - dVar53;
  local_1508[4] = local_1508[4] - dVar53;
  local_1508[5] = dVar53 + local_1508[5];
  dVar49 = (adStack_15c0[2] * adStack_15c0[5] * -13.037037037037036 +
           (-0.0013333333333333333 -
           ((dStack_1340 - (local_1348 + dStack_1360)) + 1.0) * 0.0006666666666666666) *
           -7.029234294042697e-07 * adStack_15c0[6]) * dVar185;
  dVar53 = dVar185 * 9777.777777777777;
  dVar50 = adStack_15c0[5] * dVar53;
  if (iVar36 == 0) {
    local_1418 = (double)local_1410._8_8_ * 0.73;
    local_1410._0_8_ = dVar50 + (double)local_1410._8_8_;
    local_1400._8_8_ = (double)local_1410._8_8_ + adStack_15c0[2] * dVar53;
    local_1400._0_8_ = local_1410._8_8_;
    dStack_13f0 = -(dVar185 * 7.029234294042697e-07) + (double)local_1410._8_8_ * 3.65;
    local_13d8._8_8_ = local_1410._8_8_;
    local_13d8._0_8_ = local_1410._8_8_;
    local_13e8._8_8_ = local_1410._8_8_;
    local_13e8._0_8_ = local_1410._8_8_;
    local_13c8 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    local_13b0 = (double)local_1410._8_8_;
    dStack_13a8 = (double)local_1410._8_8_;
    dStack_13c0 = (double)local_1410._8_8_;
    dStack_13b8 = (double)local_1410._8_8_;
    dStack_13a0 = (double)local_1410._8_8_;
    dStack_1398 = (double)local_1410._8_8_;
    dStack_1390 = (double)local_1410._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_ * 0.38;
    pdVar35 = &local_1260;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-4] = pdVar35[-4] - dVar53;
      pdVar35[-1] = pdVar35[-1] - dVar53;
      *pdVar35 = dVar53 + *pdVar35;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
    local_1698 = local_f10;
  }
  else {
    dVar51 = (double)local_1410._8_8_ * -0.27;
    local_1288[1] = local_1288[1] - dVar51;
    local_1268 = local_1268 - dVar51;
    local_1260 = dVar51 + local_1260;
    adStack_11e0[2] = adStack_11e0[2] - dVar50;
    adStack_11e0[5] = adStack_11e0[5] - dVar50;
    adStack_11e0[6] = dVar50 + adStack_11e0[6];
    dVar53 = dVar53 * adStack_15c0[2];
    local_fc0 = local_fc0 - dVar53;
    dStack_fa8 = dStack_fa8 - dVar53;
    local_fa0 = dVar53 + local_fa0;
    dVar53 = (double)local_1410._8_8_ * 2.65 - dVar185 * 7.029234294042697e-07;
    local_1698 = local_f10 - dVar53;
    local_ef8 = local_ef8 - dVar53;
    local_ef0 = dVar53 + local_ef0;
    local_ba0 = local_ba0 - (double)local_1410._8_8_;
    local_b88 = local_b88 - (double)local_1410._8_8_;
    local_b80 = local_b80 + (double)local_1410._8_8_;
    dVar53 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
    local_620 = local_620 - dVar53;
    local_608 = local_608 - dVar53;
    local_600 = dVar53 + local_600;
    local_1410._8_8_ = (double)local_1410._8_8_ * -0.62;
    local_4c0 = local_4c0 - (double)local_1410._8_8_;
    local_4a8 = local_4a8 - (double)local_1410._8_8_;
    local_4a0 = (double)local_1410._8_8_ + local_4a0;
  }
  dStack_3f8 = dStack_3f8 - dVar49;
  local_3f0 = dVar49 + local_3f0;
  dVar53 = adStack_15c0[6] * adStack_15c0[2] * local_1560;
  dVar50 = adStack_15c0[6] * local_1550 * 4989960.261382571 + dVar53 * -1002.9930150071424;
  dVar53 = adStack_15c0[6] * local_1550 * 15645.595296379073 +
           (0.0031354148083023287 -
           (((dStack_1360 + dStack_1340 + dStack_1310) - (dStack_1340 + dStack_1300)) + -1.0) *
           0.0006666666666666666) * -1002.9930150071424 * dVar53;
  dVar185 = adStack_15c0[6] * -1002.9930150071424 * local_1560;
  adStack_11e0[2] = adStack_11e0[2] + dVar185;
  adStack_11e0[0xc] = adStack_11e0[0xc] + dVar185;
  adStack_11e0[0xe] = adStack_11e0[0xe] - dVar185;
  dVar51 = local_1550 * 4989960.261382571 + local_1560 * adStack_15c0[2] * -1002.9930150071424;
  local_f10 = local_1698 + dVar51;
  local_ec0 = local_ec0 + dVar51;
  local_eb0 = local_eb0 - dVar51;
  dVar185 = adStack_15c0[2] * -1002.9930150071424 * adStack_15c0[6];
  local_af0 = local_af0 + dVar185;
  dStack_aa0 = dStack_aa0 + dVar185;
  dStack_a90 = dStack_a90 - dVar185;
  dVar185 = adStack_15c0[6] * 4989960.261382571;
  local_990 = local_990 + dVar185;
  dStack_940 = dStack_940 + dVar185;
  local_930 = local_930 - dVar185;
  local_410._0_8_ = ((double)local_410._0_8_ - dVar49) + dVar53;
  dStack_3c0 = dStack_3c0 + dVar53;
  dStack_3b0 = dStack_3b0 - dVar53;
  dVar53 = local_1528 + local_1528 +
           local_1560 * 0.5 + ((dVar155 + adStack_15c0[1]) - adStack_15c0[6]) + dStack_1568 +
           dStack_1558;
  local_1410._8_8_ =
       local_1550 * 415830.02178188093 + local_1560 * adStack_15c0[2] * -83.5827512505952;
  dVar185 = (double)local_1410._8_8_ * dVar53;
  local_1508[1] = local_1508[1] + dVar50 + dVar185;
  local_1508[0xb] = local_1508[0xb] + dVar50 + dVar185;
  local_1508[0xd] = (local_1508[0xd] - dVar50) - dVar185;
  dVar185 = (local_1550 * 1303.7996080315893 +
            (0.0031354148083023287 -
            (((dStack_1310 + dStack_1360) - dStack_1300) + -1.0) * 0.0006666666666666666) *
            -83.5827512505952 * local_1560 * adStack_15c0[2]) * dVar53;
  dVar155 = dVar53 * 415830.02178188093;
  dVar53 = dVar53 * 83.5827512505952;
  local_1418 = (double)local_1410._8_8_ + (double)local_1410._8_8_;
  if (iVar36 == 0) {
    local_1410._0_8_ = (double)local_1410._8_8_ - local_1560 * dVar53;
    local_1400._8_8_ = local_1410._8_8_;
    local_1400._0_8_ = local_1410._8_8_;
    local_13d8._8_8_ = local_1410._8_8_;
    local_13d8._0_8_ = local_1410._8_8_;
    local_13e8._8_8_ = local_1410._8_8_;
    local_13e8._0_8_ = local_1410._8_8_;
    local_13c8 = local_1418;
    dStack_13c0 = (double)local_1410._8_8_ * 1.5 - dVar53 * adStack_15c0[2];
    dStack_13b8 = local_1418;
    local_13b0 = dVar155 + (double)local_1410._8_8_;
    dStack_1398 = (double)local_1410._8_8_;
    dStack_1390 = (double)local_1410._8_8_;
    dStack_13a8 = (double)local_1410._8_8_;
    dStack_13a0 = (double)local_1410._8_8_;
    local_1388 = (double)local_1410._8_8_ * 3.0;
    local_1380 = (double)local_1410._8_8_;
    local_1378 = (double)local_1410._8_8_;
    pdVar35 = &local_1220;
    lVar34 = 0;
    do {
      dVar53 = *(double *)(local_1410 + lVar34 * 8 + -8);
      pdVar35[-0xc] = pdVar35[-0xc] + dVar53;
      pdVar35[-2] = pdVar35[-2] + dVar53;
      *pdVar35 = *pdVar35 - dVar53;
      lVar34 = lVar34 + 1;
      pdVar35 = pdVar35 + 0x16;
    } while (lVar34 != 0x15);
    local_1678 = adStack_11e0[2];
  }
  else {
    local_1288[1] = local_1288[1] + (double)local_1410._8_8_;
    dStack_1230 = dStack_1230 + (double)local_1410._8_8_;
    local_1220 = local_1220 - (double)local_1410._8_8_;
    dVar50 = -dVar53 * local_1560;
    local_1678 = adStack_11e0[2] + dVar50;
    adStack_11e0[0xc] = adStack_11e0[0xc] + dVar50;
    adStack_11e0[0xe] = adStack_11e0[0xe] - dVar50;
    local_f10 = (local_1698 + dVar51) - (double)local_1410._8_8_;
    local_ec0 = local_ec0 - (double)local_1410._8_8_;
    local_eb0 = local_eb0 + (double)local_1410._8_8_;
    local_ba0 = local_ba0 + (double)local_1410._8_8_;
    local_b50 = local_b50 + (double)local_1410._8_8_;
    local_b40 = local_b40 - (double)local_1410._8_8_;
    dVar53 = (double)local_1410._8_8_ * 0.5 - dVar53 * adStack_15c0[2];
    local_af0 = local_af0 + dVar53;
    dStack_aa0 = dStack_aa0 + dVar53;
    dStack_a90 = dStack_a90 - dVar53;
    local_a40 = local_a40 + (double)local_1410._8_8_;
    local_9f0 = local_9f0 + (double)local_1410._8_8_;
    local_9e0 = local_9e0 - (double)local_1410._8_8_;
    local_990 = local_990 + dVar155;
    dStack_940 = dStack_940 + dVar155;
    local_930 = local_930 - dVar155;
    local_620 = local_620 + local_1418;
    local_5d0 = local_5d0 + local_1418;
    local_5c0 = local_5c0 - local_1418;
  }
  dVar54 = adStack_15c0[3] * 1831069.794862108;
  local_1288[2] = local_1288[2] - dVar54;
  dVar53 = adStack_15c0[1] * 1831069.794862108;
  adStack_11e0[0x17] = adStack_11e0[0x17] - dVar53;
  dVar157 = adStack_15c0[2] * -1587014.959464585;
  dVar155 = adStack_15c0[5] * -0.44037520695372745;
  dVar158 = adStack_15c0[3] * 20000000.0;
  local_e58 = local_e58 - dVar158;
  auVar2._8_4_ = SUB84(dVar158 + dStack_e48,0);
  auVar2._0_8_ = dVar158 + local_e50;
  auVar2._12_4_ = (int)((ulong)(dVar158 + dStack_e48) >> 0x20);
  dVar272 = adStack_15c0[7] * 20000000.0;
  dVar279 = adStack_15c0[8] * 80000000.0;
  dVar294 = adStack_15c0[3] * adStack_15c0[1] * 1831069.794862108 +
            adStack_15c0[2] * adStack_15c0[5] * -1587014.959464585;
  dVar159 = adStack_15c0[5] * -1587014.959464585;
  dVar295 = adStack_15c0[3] * adStack_15c0[1] * 5835.198557030137 +
            (0.0031867701457385282 -
            ((local_1348 + dStack_1360) - (local_1368 + local_1358)) * 0.0006666666666666666) *
            -1587014.959464585 * adStack_15c0[2] * adStack_15c0[5];
  dVar303 = adStack_15c0[7] * adStack_15c0[3] * 0.0 +
            (0.0 - ((dStack_1350 + local_1348) - (local_1358 + local_1338)) * 0.0006666666666666666)
            * -0.44037520695372745 * adStack_15c0[5] * adStack_15c0[4];
  dVar55 = adStack_15c0[4] * -0.44037520695372745;
  local_10f8 = local_10f8 - dVar272;
  dStack_10f0 = dStack_10f0 - dVar279;
  dVar160 = adStack_15c0[3] * 80000000.0;
  local_da8 = local_da8 - dVar160;
  dVar187 = adStack_15c0[2] * -2.787694465907913e-05;
  dVar104 = local_1550 * -2.787694465907913e-05;
  dVar119 = local_1550 * -1.2126178147109573e-07;
  dVar285 = (double)CONCAT44(uStack_1574,local_1578) * 15000000.0;
  local_10e8 = local_10e8 - dVar285;
  dVar105 = adStack_15c0[3] * 15000000.0;
  local_cf8 = local_cf8 - dVar105;
  local_ca0 = dVar105 + local_ca0;
  dVar233 = adStack_15c0[2] * -1.2126178147109573e-07;
  local_958 = local_958 - dVar233;
  dVar49 = local_1550 * adStack_15c0[2];
  dVar188 = dStack_1548 * -0.12993945039280527;
  dVar189 = dStack_1570 * 84300000.0;
  dVar234 = adStack_15c0[3] * 84300000.0;
  dVar56 = adStack_15c0[2] * -0.12993945039280527;
  dVar255 = adStack_15c0[7] * adStack_15c0[3] * 20000000.0 +
            adStack_15c0[5] * adStack_15c0[4] * -0.44037520695372745;
  dVar266 = adStack_15c0[8] * adStack_15c0[3] * 80000000.0 + dVar49 * -2.787694465907913e-05;
  dVar145 = adStack_15c0[8] * adStack_15c0[3] * 0.0 +
            (0.0 - ((dStack_1300 + dStack_1360) - (dStack_1330 + local_1358)) *
                   0.0006666666666666666) * -2.787694465907913e-05 * dVar49;
  dVar50 = adStack_15c0[3] * (double)CONCAT44(uStack_1574,local_1578);
  dVar121 = dVar50 * 0.0 +
            (0.0 - ((dStack_1360 + dStack_1300) - (local_1358 + local_1328)) * 0.0006666666666666666
            ) * -1.2126178147109573e-07 * dVar49;
  dVar147 = dStack_1570 * adStack_15c0[3] * 0.0 +
            (0.0 - ((dStack_1360 + local_12f8) - (local_1358 + dStack_1320)) * 0.0006666666666666666
            ) * -0.12993945039280527 * adStack_15c0[2] * dStack_1548;
  dVar273 = dVar50 * 15000000.0 + dVar49 * -1.2126178147109573e-07;
  dVar280 = dStack_1570 * adStack_15c0[3] * 84300000.0 +
            adStack_15c0[2] * dStack_1548 * -0.12993945039280527;
  dVar296 = adStack_15c0[3] * dStack_1568 * 3309407.0851908242 +
            adStack_15c0[5] * dStack_1570 * -141857.17388911778;
  dVar200 = adStack_15c0[3] * dStack_1568 * 9674.740273245088 +
            (0.002923405922631374 -
            ((dStack_1320 + local_1348) - (local_1318 + local_1358)) * 0.0006666666666666666) *
            -141857.17388911778 * adStack_15c0[5] * dStack_1570;
  dVar146 = dStack_1570 * -141857.17388911778;
  dVar21 = adStack_15c0[5] * -141857.17388911778;
  dVar235 = adStack_15c0[3] * 3309407.0851908242;
  dStack_b98 = dStack_b98 - dVar235;
  dVar122 = dStack_1568 * 3309407.0851908242;
  dVar148 = local_1550 * 30000000.0;
  local_10d8 = local_10d8 - dVar122;
  dVar57 = adStack_15c0[5] * -1.316420144391347e-05;
  dVar58 = adStack_15c0[3] * 30000000.0;
  dVar123 = adStack_15c0[2] * -9.717850050148037e-07;
  local_9e0 = local_9e0 - dVar123;
  dStack_938 = dVar58 + dStack_938;
  dVar256 = local_1550 * adStack_15c0[3] * 0.0 +
            (0.0 - ((local_1348 + dStack_1310) - (dStack_1300 + local_1358)) * 0.0006666666666666666
            ) * -1.316420144391347e-05 * adStack_15c0[5] * local_1560;
  dVar267 = adStack_15c0[3] * local_1550 * 0.0 +
            (0.0 - ((local_1308 + dStack_1360) - (local_1358 + dStack_1300)) * 0.0006666666666666666
            ) * -9.717850050148037e-07 * adStack_15c0[2] * dStack_1558;
  dVar222 = local_1560 * -1.316420144391347e-05;
  dVar306 = local_1550 * adStack_15c0[3] * 30000000.0 +
            adStack_15c0[5] * local_1560 * -1.316420144391347e-05;
  dVar314 = adStack_15c0[3] * local_1550 * 30000000.0 +
            adStack_15c0[2] * dStack_1558 * -9.717850050148037e-07;
  dVar59 = dStack_1558 * -9.717850050148037e-07;
  dVar274 = local_1550 * 30000000.0;
  dVar281 = dStack_1548 * 11893241.704910735;
  dVar223 = dStack_1548 * adStack_15c0[3] * 11893241.704910735 +
            adStack_15c0[5] * local_1550 * -2811.709768791155;
  dVar257 = local_1550 * -2811.709768791155;
  dVar124 = adStack_15c0[5] * -2811.709768791155;
  dVar60 = adStack_15c0[3] * 11893241.704910735;
  dVar61 = dStack_1570 * -14.898178128775022;
  local_988 = (((((local_988 - dVar187) - dVar233) - dVar58) - dVar58) - dVar124) - dVar61;
  local_918 = local_918 - dVar61;
  dVar62 = adStack_15c0[3] * 11574309.207109384;
  local_778 = local_778 - dVar62;
  local_720 = local_720 + dVar62;
  dVar224 = local_1538 * 11574309.207109384;
  dVar230 = dStack_1530 * 132000000.0;
  local_10a8 = local_10a8 - dVar224;
  dVar50 = ((dVar189 + (double)local_10c0._8_8_) - dVar281) + dVar230;
  local_10c0._8_4_ = SUB84(dVar50,0);
  local_10c0._0_8_ =
       (((dVar285 + (double)local_10c0._0_8_ + dVar279) - dVar148) - dVar274) + dVar281 + dVar224;
  local_10c0._12_4_ = (int)((ulong)dVar50 >> 0x20);
  dVar63 = local_1550 * -14.898178128775022;
  dVar107 = dStack_1548 * -0.00037751521951089154;
  dVar64 = dStack_1570 * -0.00037751521951089154;
  local_8d8 = ((local_8d8 - dVar56) - dVar60) - dVar64;
  local_860 = local_860 - dVar64;
  dVar65 = adStack_15c0[3] * 132000000.0;
  local_668 = local_668 + dVar65;
  dVar236 = dStack_1548 * adStack_15c0[3] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((local_1348 + dStack_1300) - (local_1358 + local_12f8)) * 0.0006666666666666666) *
            -2811.709768791155 * adStack_15c0[5] * local_1550;
  dVar125 = adStack_15c0[3] * local_1538 * 14690.152683074684 +
            (0.0012692034073231281 -
            ((dStack_1320 + dStack_1300) - (local_1358 + local_12e8)) * 0.0006666666666666666) *
            -14.898178128775022 * dStack_1570 * local_1550;
  dVar149 = adStack_15c0[3] * dStack_1530 * 0.0 +
            (0.0 - ((dStack_1320 + local_12f8) - (local_1358 + dStack_12e0)) * 0.0006666666666666666
            ) * -0.00037751521951089154 * dStack_1570 * dStack_1548;
  dVar201 = adStack_15c0[3] * local_1538 * 11574309.207109384 +
            dStack_1570 * local_1550 * -14.898178128775022;
  dVar217 = adStack_15c0[3] * dStack_1530 * 132000000.0 +
            dStack_1570 * dStack_1548 * -0.00037751521951089154;
  dVar297 = adStack_15c0[3] * local_1528 * 16686316.432824839 +
            dStack_1530 * adStack_15c0[5] * -64695.71318864056;
  dVar50 = adStack_15c0[3] * local_1528 * 42593.141495423035 +
           (0.00255257903485727 -
           ((dStack_12e0 + local_1348) - (local_12d8 + local_1358)) * 0.0006666666666666666) *
           -64695.71318864056 * dStack_1530 * adStack_15c0[5];
  dVar161 = dStack_1530 * -64695.71318864056;
  dVar258 = adStack_15c0[5] * -64695.71318864056;
  local_6c8 = (local_6c8 - dVar65) - dVar258;
  dVar66 = adStack_15c0[3] * 16686316.432824839;
  dStack_618 = dStack_618 - dVar66;
  dVar126 = local_1560 * 0.2714339464219018;
  local_1018 = dVar126 + local_1018;
  dVar67 = adStack_15c0[4] * 0.2714339464219018;
  dStack_ae8 = (dStack_ae8 - dVar57) + dVar67;
  dVar162 = adStack_15c0[3] * -0.32764529688590877;
  dStack_a38 = (dStack_a38 - dVar123) + dVar162;
  local_a30 = local_a30 - dVar162;
  dVar49 = dStack_1548 * 148.64629960980085;
  dVar51 = adStack_15c0[7] * -1595994.8383312945;
  dVar68 = adStack_15c0[4] * 148.64629960980085;
  dVar190 = local_1560 * adStack_15c0[4] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((local_1358 + local_1308) - (dStack_1350 + dStack_1310)) * 0.0006666666666666666) *
            -0.32764529688590877 * adStack_15c0[3] * dStack_1558;
  dVar197 = dStack_1548 * adStack_15c0[4] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((dStack_1300 + local_1338) - (dStack_1350 + local_12f8)) * 0.0006666666666666666) *
            -1595994.8383312945 * adStack_15c0[7] * local_1550;
  dVar69 = dStack_1558 * -0.32764529688590877;
  dVar108 = local_1528 * 16686316.432824839;
  local_10a0 = (local_10a0 - dVar230) + dVar108;
  local_1098 = local_1098 - dVar108;
  dStack_10d0 = (dVar148 + dStack_10d0) - dVar69;
  local_10c8 = dVar69 + local_10c8 + dVar274;
  dVar259 = local_1560 * adStack_15c0[4] * 0.2714339464219018 +
            adStack_15c0[3] * dStack_1558 * -0.32764529688590877;
  dVar268 = dStack_1548 * adStack_15c0[4] * 148.64629960980085 +
            adStack_15c0[7] * local_1550 * -1595994.8383312945;
  dVar163 = local_1550 * -1595994.8383312945;
  dStack_e48 = auVar2._8_8_;
  dVar225 = adStack_15c0[5] * -10782603.17894348;
  dVar216 = ((dVar272 + local_1110) - dVar69) - dVar225;
  dVar52 = dVar272 + dVar53 + dStack_1108 + dVar122 + dVar148 + dVar281 + dVar108 + dVar225;
  auVar15._8_4_ = SUB84(dVar52,0);
  auVar15._0_8_ = dVar216;
  auVar15._12_4_ = (int)((ulong)dVar52 >> 0x20);
  dVar127 = adStack_15c0[3] * -10782603.17894348;
  dVar316 = adStack_15c0[1] * -0.4971315070618765;
  dVar319 = adStack_15c0[2] * 659416.0587695736;
  dVar102 = adStack_15c0[4] * -0.4971315070618765;
  local_1288[3] = local_1288[3] + dVar102;
  local_1258 = local_1258 - dVar102;
  dVar70 = adStack_15c0[7] * 19568365.243600544;
  dVar109 = adStack_15c0[4] * 659416.0587695736;
  adStack_11e0[3] =
       (((((adStack_11e0[3] - dVar159) - dVar104) - dVar119) - dVar188) - dVar59) + dVar109;
  dVar71 = adStack_15c0[4] * adStack_15c0[2] * 659416.0587695736 +
           adStack_15c0[3] * adStack_15c0[5] * -10782603.17894348;
  dVar275 = adStack_15c0[4] * adStack_15c0[2] * 2125.623798113147 +
            (0.0032234941352193023 -
            ((local_1358 + local_1348) - (dStack_1360 + dStack_1350)) * 0.0006666666666666666) *
            -10782603.17894348 * adStack_15c0[3] * adStack_15c0[5];
  dVar72 = adStack_15c0[2] * adStack_15c0[7] * 19568365.243600544 +
           adStack_15c0[1] * adStack_15c0[4] * -0.4971315070618765;
  dVar22 = adStack_15c0[2] * adStack_15c0[7] * 4674.103192900765 +
           adStack_15c0[1] * adStack_15c0[4] *
           (0.00023886017736864045 -
           ((dStack_1350 + local_1368) - (dStack_1360 + local_1338)) * 0.0006666666666666666) *
           -0.4971315070618765;
  local_1078 = local_1078 + dVar316;
  dVar52 = adStack_15c0[2] * 19568365.243600544;
  local_e68 = local_e68 + dVar52;
  dVar23 = adStack_15c0[7] * adStack_15c0[2] * 108289848.15442011 +
           adStack_15c0[5] * adStack_15c0[5] * -38.98923487337139;
  dVar30 = adStack_15c0[7] * adStack_15c0[2] * 15379.207897229715 +
           (0.00014201892568266544 -
           ((local_1348 + local_1348) - (local_1338 + dStack_1360)) * 0.0006666666666666666) *
           -38.98923487337139 * adStack_15c0[5] * adStack_15c0[5];
  dVar237 = adStack_15c0[7] * 108289848.15442011;
  dVar73 = adStack_15c0[5] * -77.97846974674277;
  adStack_11e0[7] = (adStack_11e0[7] - dVar70) - dVar237;
  dVar191 = adStack_15c0[2] * 108289848.15442011;
  local_e60 = (local_e60 - dVar52) - dVar191;
  dVar74 = adStack_15c0[1] * -120140.80184495587;
  dVar75 = adStack_15c0[2] * 2429212.6664140443;
  local_ba8 = local_ba8 + dVar75;
  local_ba0 = local_ba0 - dVar75;
  dVar226 = adStack_15c0[2] * dStack_1568 * 8512.899029058015 +
            (0.003504386069921407 -
            ((dStack_1320 + local_1368) - (dStack_1360 + local_1318)) * 0.0006666666666666666) *
            -120140.80184495587 * adStack_15c0[1] * dStack_1570;
  dVar231 = local_1550 * adStack_15c0[2] * 0.0 +
            (0.0 - ((dStack_1310 + local_1368) - (dStack_1300 + dStack_1360)) *
                   0.0006666666666666666) * -3.716149717925534e-05 * local_1560 * adStack_15c0[1];
  dVar286 = dStack_1570 * -120140.80184495587;
  dVar291 = local_1560 * -3.716149717925534e-05;
  local_1238 = local_1238 - dVar286;
  dStack_1230 = dVar291 + dStack_1230;
  dVar192 = dStack_1568 * 2429212.6664140443;
  dVar198 = local_1550 * 73400000.0;
  adStack_11e0[0xb] = adStack_11e0[0xb] - dVar192;
  dVar164 = adStack_15c0[1] * -3.716149717925534e-05;
  local_af8 = local_af8 + dVar164;
  dVar307 = adStack_15c0[2] * 73400000.0;
  dVar128 = adStack_15c0[2] * dStack_1568 * 2429212.6664140443 +
            adStack_15c0[1] * dStack_1570 * -120140.80184495587;
  dVar150 = local_1550 * adStack_15c0[2] * 73400000.0 +
            local_1560 * adStack_15c0[1] * -3.716149717925534e-05;
  dVar31 = adStack_15c0[2] * dStack_1548 * 16575581.576889673 +
           local_1550 * adStack_15c0[1] * -4521.295558798051;
  dVar129 = adStack_15c0[2] * dStack_1548 * 23743.85449528333 +
            (0.0014324598135602037 -
            ((dStack_1300 + local_1368) - (dStack_1360 + local_12f8)) * 0.0006666666666666666) *
            -4521.295558798051 * local_1550 * adStack_15c0[1];
  dVar202 = local_1550 * -4521.295558798051;
  local_1220 = (local_1220 - dVar291) + dVar202;
  local_1218 = local_1218 - dVar202;
  dVar260 = dStack_1548 * 16575581.576889673;
  adStack_11e0[0xe] = (((dVar119 + adStack_11e0[0xe] + dVar104) - dVar59) - dVar198) + dVar260;
  dVar298 = adStack_15c0[1] * -4521.295558798051;
  local_998 = local_998 + dVar307 + dVar298;
  local_990 = ((local_990 + dVar187 + dVar233 + dVar58) - dVar307) - dVar298;
  dVar76 = adStack_15c0[2] * 16575581.576889673;
  local_8e8 = local_8e8 + dVar76;
  dVar24 = adStack_15c0[2] * local_1540 * 32000000.0 +
           adStack_15c0[5] * dStack_1570 * -10291.734087429853;
  dVar193 = adStack_15c0[2] * local_1540 * 0.0 +
            (0.0 - ((local_1348 + dStack_1320) - (dStack_1360 + dStack_12f0)) *
                   0.0006666666666666666) * -10291.734087429853 * adStack_15c0[5] * dStack_1570;
  dVar203 = local_1540 * 32000000.0;
  adStack_11e0[0x10] = adStack_11e0[0x10] - dVar203;
  dVar120 = dStack_1570 * -10291.734087429853;
  dVar77 = adStack_15c0[5] * -10291.734087429853;
  dVar165 = adStack_15c0[2] * 32000000.0;
  local_830 = local_830 - dVar165;
  dVar25 = adStack_15c0[2] * local_1528 * 9958163.265843963 +
           adStack_15c0[1] * dStack_1530 * -44546.96801065157;
  dVar78 = adStack_15c0[2] * local_1528 * 29384.200706874846 +
           (0.0029507651082264627 -
           ((local_1368 + dStack_12e0) - (dStack_1360 + local_12d8)) * 0.0006666666666666666) *
           -44546.96801065157 * adStack_15c0[1] * dStack_1530;
  dVar204 = dStack_1530 * -44546.96801065157;
  local_1200 = local_1200 + dVar204;
  local_11f8[0] = local_11f8[0] - dVar204;
  dVar156 = local_1528 * 9958163.265843963;
  adStack_11e0[0x13] = adStack_11e0[0x13] - dVar156;
  dVar130 = adStack_15c0[1] * -44546.96801065157;
  local_6d8 = local_6d8 + dVar130;
  dVar166 = adStack_15c0[2] * 9958163.265843963;
  local_628 = local_628 + dVar166;
  local_620 = local_620 - dVar166;
  dVar205 = adStack_15c0[1] * adStack_15c0[5] * 4271828.084344627 +
            adStack_15c0[2] * adStack_15c0[6] * -121922.904977942;
  dVar299 = adStack_15c0[1] * adStack_15c0[5] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((dStack_1360 + dStack_1340) - (local_1368 + local_1348)) * 0.0006666666666666666) *
            -121922.904977942 * adStack_15c0[2] * adStack_15c0[6];
  dVar206 = adStack_15c0[5] * 34296205.4093863;
  local_1658 = (double)CONCAT44(uStack_1574,local_1578);
  local_1648 = (double)CONCAT44(uStack_1574,local_1578);
  dVar79 = adStack_15c0[5] * 4271828.084344627;
  local_1268 = (dVar54 + local_1268) - dVar79;
  local_1260 = dVar79 + local_1260;
  dVar317 = adStack_15c0[6] * -121922.904977942;
  adStack_11e0[6] = dVar317 + adStack_11e0[6];
  dVar227 = adStack_15c0[1] * 4271828.084344627;
  local_fc8 = (local_fc8 - dVar157) - dVar227;
  dVar131 = adStack_15c0[2] * -121922.904977942;
  local_f18 = local_f18 - dVar131;
  local_f10 = local_f10 + dVar131;
  dVar253 = adStack_15c0[6] * -100069.45216403608;
  dStack_1108 = auVar15._8_8_;
  local_1100 = dVar253 + local_1100;
  dVar283 = adStack_15c0[6] * -0.024867627282709664;
  dVar292 = dVar283 + dVar316 + ((((dVar155 + dStack_1060) - dVar126) - dVar49) - dVar319);
  dVar186 = (dVar319 + dVar155 + dStack_1058) - dVar283;
  auVar16._8_4_ = SUB84(dVar186,0);
  auVar16._0_8_ = dVar292;
  auVar16._12_4_ = (int)((ulong)dVar186 >> 0x20);
  dVar214 = adStack_15c0[3] * -100069.45216403608;
  dVar117 = adStack_15c0[4] * -0.024867627282709664;
  auVar28._8_4_ = SUB84(local_f00 + dVar117,0);
  auVar28._0_8_ = dStack_f08 + dVar214;
  auVar28._12_4_ = (int)((ulong)(local_f00 + dVar117) >> 0x20);
  local_ee8 = local_ee8 - dVar117;
  dVar207 = dVar206 + ((dVar158 + local_e50) - dVar163) + dVar52;
  dVar186 = (dVar191 + dVar191 + dStack_e48) - dVar206;
  local_e40 = local_e40 + dVar206;
  auVar17._8_4_ = SUB84(dVar186,0);
  auVar17._0_8_ = dVar207;
  auVar17._12_4_ = (int)((ulong)dVar186 >> 0x20);
  dVar186 = adStack_15c0[5] * adStack_15c0[7];
  dVar221 = adStack_15c0[5] * adStack_15c0[8];
  auVar3._8_4_ = SUB84(dVar221,0);
  auVar3._0_8_ = dVar186;
  auVar3._12_4_ = (int)((ulong)dVar221 >> 0x20);
  dVar208 = adStack_15c0[7] * 34296205.4093863;
  dVar218 = adStack_15c0[8] * 20000000.0;
  local_1658 = local_1658 * 30000000.0;
  dVar304 = adStack_15c0[5] * 6077655.854054699;
  dVar254 = dStack_1548 * adStack_15c0[2];
  dVar80 = dVar186 * 34296205.4093863 + adStack_15c0[4] * adStack_15c0[6] * -0.024867627282709664;
  dVar110 = dVar221 * 20000000.0 + dVar254 * -0.029479148639814108;
  dVar308 = adStack_15c0[5] * 20000000.0;
  dVar32 = adStack_15c0[5] * local_1648 * 30000000.0 + dVar254 * -0.001025849604117461;
  dVar215 = adStack_15c0[5] * adStack_15c0[5] * 3038827.9270273494 +
            adStack_15c0[6] * adStack_15c0[3] * -100069.45216403608;
  dVar81 = dStack_1548 * -0.029479148639814108;
  dVar111 = dStack_1548 * -0.001025849604117461;
  adStack_11e0[0xf] = dVar111 + ((dVar188 + adStack_11e0[0xf]) - dVar260) + dVar81;
  dVar101 = ((((local_fc0 + dVar157) - dVar127) - dVar73) - dVar120) + dVar227 + dVar218 +
            local_1658;
  dVar221 = dVar127 + ((((((dStack_fb8 - dVar157) - dVar55) - dVar146) - dVar222) - dVar257) -
                      dVar161) + dVar304;
  auVar18._8_4_ = SUB84(dVar221,0);
  auVar18._0_8_ = dVar101;
  auVar18._12_4_ = (int)((ulong)dVar221 >> 0x20);
  dVar118 = adStack_15c0[5] * 30000000.0;
  dVar261 = adStack_15c0[2] * -0.029479148639814108;
  dVar269 = adStack_15c0[2] * -0.001025849604117461;
  local_8e0 = ((local_8e0 + dVar56) - dVar76) + dVar261 + dVar269;
  dStack_1660 = auVar3._8_8_;
  dVar186 = dVar186 * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((dStack_1340 + dStack_1350) - (local_1348 + local_1338)) * 0.0006666666666666666) *
            -0.024867627282709664 * adStack_15c0[4] * adStack_15c0[6];
  dVar103 = dStack_1660 * 0.0 +
            (0.0 - ((local_12f8 + dStack_1360) - (local_1348 + dStack_1330)) * 0.0006666666666666666
            ) * -0.029479148639814108 * dVar254;
  dVar228 = adStack_15c0[5] * local_1648 * 0.0 +
            (0.0 - ((local_12f8 + dStack_1360) - (local_1328 + local_1348)) * 0.0006666666666666666)
            * -0.001025849604117461 * dVar254;
  dVar232 = adStack_15c0[5] * adStack_15c0[5] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((dStack_1340 + local_1358) - (local_1348 + local_1348)) * 0.0006666666666666666) *
            -100069.45216403608 * adStack_15c0[6] * adStack_15c0[3];
  dVar82 = adStack_15c0[6] * -37781.99143773652;
  local_d90 = local_d90 + dVar82;
  dVar132 = dStack_1570 * 1097137.153737377;
  dVar151 = dStack_1570 * 25010000.0;
  dVar221 = adStack_15c0[6] * (double)CONCAT44(uStack_1574,local_1578);
  dVar133 = adStack_15c0[8] * -37781.99143773652;
  dVar152 = (double)CONCAT44(uStack_1574,local_1578) * -37124457.44676649;
  dVar134 = adStack_15c0[6] * -37124457.44676649;
  dVar135 = adStack_15c0[5] * 1097137.153737377;
  dVar153 = adStack_15c0[5] * 25010000.0;
  dVar167 = dStack_1570 * adStack_15c0[5] * 1097137.153737377 +
            adStack_15c0[6] * adStack_15c0[8] * -37781.99143773652;
  dVar177 = adStack_15c0[5] * dStack_1570 * 25010000.0 + dVar221 * -37124457.44676649;
  dVar83 = dStack_1570 * adStack_15c0[5] * 2500.221646810261 +
           (0.00227885970162737 -
           ((dStack_1340 + dStack_1330) - (dStack_1320 + local_1348)) * 0.0006666666666666666) *
           -37781.99143773652 * adStack_15c0[6] * adStack_15c0[8];
  dVar112 = adStack_15c0[5] * dStack_1570 * 0.0 +
            (0.0 - ((dStack_1340 + local_1328) - (local_1348 + dStack_1320)) * 0.0006666666666666666
            ) * -37124457.44676649 * dVar221;
  local_1298 = dVar112 + ((local_3d8 - dVar121) - dVar228);
  dVar136 = adStack_15c0[5] * dStack_1568 * 4238127.66170656 +
            adStack_15c0[6] * dStack_1570 * -5982.3326554224905;
  dVar221 = adStack_15c0[5] * dStack_1568 * 7478.008612521503 +
            (0.0017644604432492119 -
            ((dStack_1320 + dStack_1340) - (local_1318 + local_1348)) * 0.0006666666666666666) *
            -5982.3326554224905 * adStack_15c0[6] * dStack_1570;
  dVar84 = dStack_1568 * 4238127.66170656;
  local_f78 = (local_f78 - dVar146) - dVar84;
  dVar276 = dStack_1570 * -5982.3326554224905;
  local_ed0 = ((local_ed0 - dVar133) - dVar152) + dVar276;
  local_ec8 = local_ec8 - dVar276;
  dVar26 = adStack_15c0[6] * -5982.3326554224905;
  local_c30 = local_c30 + dVar135 + dVar153 + dVar26;
  dVar168 = adStack_15c0[5] * 4238127.66170656;
  local_b88 = (local_b88 + dVar235) - dVar168;
  local_b80 = local_b80 + dVar168;
  dVar169 = adStack_15c0[2] * -27278.71839873273;
  local_a40 = local_a40 + dVar123 + dVar169;
  dVar209 = local_1560 * -7.225013822780462e-07;
  dVar210 = adStack_15c0[5] * 369528.79729527823;
  dVar219 = adStack_15c0[6] * -7.225013822780462e-07;
  dVar85 = adStack_15c0[5] * 50000000.0;
  dVar137 = dStack_1558 * -27278.71839873273;
  adStack_11e0[0xd] = dVar137 + adStack_11e0[0xd] + dVar59;
  dVar86 = local_1550 * 50000000.0;
  dVar113 = local_1560 * 369528.79729527823;
  dStack_fb8 = auVar18._8_8_;
  dVar242 = ((local_f70 + dVar222) - dVar113) + dVar86;
  auVar19._8_4_ = SUB84(dStack_f68 + dVar113,0);
  auVar19._0_8_ = dVar242;
  auVar19._12_4_ = (int)((ulong)(dStack_f68 + dVar113) >> 0x20);
  dVar309 = dStack_1548 * 22295026.02480445;
  dVar33 = local_1550 * -173.56959160214726;
  local_eb0 = (local_eb0 - dVar209) + dVar33;
  local_ea8 = local_ea8 - dVar33;
  dVar87 = adStack_15c0[6] * -173.56959160214726;
  local_970 = local_970 + dVar85 + dVar87;
  dVar254 = adStack_15c0[5] * 22295026.02480445;
  local_8c0 = local_8c0 + dVar254;
  dVar238 = adStack_15c0[5] * local_1550 * 50000000.0 +
            adStack_15c0[6] * local_1560 * -7.225013822780462e-07;
  dVar243 = adStack_15c0[5] * local_1560 * 369528.79729527823 +
            adStack_15c0[2] * dStack_1558 * -27278.71839873273;
  dVar170 = adStack_15c0[5] * dStack_1548 * 22295026.02480445 +
            adStack_15c0[6] * local_1550 * -173.56959160214726;
  dVar138 = adStack_15c0[5] * local_1550 * 0.0 +
            (0.0 - ((dStack_1340 + dStack_1310) - (dStack_1300 + local_1348)) *
                   0.0006666666666666666) * -7.225013822780462e-07 * adStack_15c0[6] * local_1560;
  dVar154 = adStack_15c0[5] * local_1560 * 308.3061146970958 +
            (0.0008343222962694802 -
            ((dStack_1360 + local_1308) - (dStack_1310 + local_1348)) * 0.0006666666666666666) *
            -27278.71839873273 * adStack_15c0[2] * dStack_1558;
  local_2e8 = dStack_3b8 + dVar267 + dVar190 + dVar154;
  dVar300 = adStack_15c0[5] * dStack_1548 * 15309.867045680163 +
            (0.0006866942890601289 -
            ((dStack_1340 + dStack_1300) - (local_1348 + local_12f8)) * 0.0006666666666666666) *
            -173.56959160214726 * adStack_15c0[6] * local_1550;
  dStack_2e0 = (((((((dVar121 + (dStack_3b0 - dVar185) + dVar145) - dVar256) - dVar267) + dVar236 +
                   dVar125 + dVar197) - dVar231) + dVar129) - dVar138) + dVar300;
  dVar88 = local_1528 * 14307411.985466668;
  local_fa0 = dVar304 + dVar227 + local_fa0 + dVar208 + dVar132 + dVar151 + dVar84 + dVar86 +
              dVar309 + dVar88;
  local_f40 = local_f40 + dVar161 + dVar88;
  local_f38 = (local_f38 - dVar161) - dVar88;
  dVar89 = dStack_1530 * -1826.7180743084757;
  local_ef8 = ((((((((local_ef8 - dVar131) - (dVar214 + dVar214)) - dVar117) - dVar133) - dVar152) -
                dVar276) - dVar209) - dVar33) - dVar89;
  local_e90 = local_e90 + dVar89;
  local_e88 = local_e88 - dVar89;
  dVar27 = adStack_15c0[6] * -1826.7180743084757;
  local_6b8 = (local_6b8 + dVar258) - dVar27;
  local_6b0 = local_6b0 + dVar27;
  dVar90 = adStack_15c0[5] * -1.061382456225949e-08;
  dStack_8b0 = (dStack_8b0 - dVar261) - dVar90;
  dVar91 = dStack_1568 * -0.5136789314491079;
  dStack_1058 = auVar16._8_8_;
  local_1028 = dVar91 + local_1028;
  dVar171 = dStack_1548 * -1.061382456225949e-08;
  dVar178 = local_1540 * -22389.705712050265;
  dStack_e48 = auVar17._8_8_;
  dStack_f50 = (dStack_f50 - dVar120) + dVar178;
  dVar92 = adStack_15c0[7] * 1000000.0;
  dVar114 = adStack_15c0[7] * 20000000.0;
  local_c28 = (local_c28 - dVar92) - dVar114;
  dVar93 = adStack_15c0[5] * -22389.705712050265;
  local_818 = local_818 + dVar165 + dVar93;
  dVar172 = local_1528 * adStack_15c0[5] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((dStack_12e0 + dStack_1340) - (local_12d8 + local_1348)) * 0.0006666666666666666) *
            -1826.7180743084757 * adStack_15c0[6] * dStack_1530;
  dVar139 = adStack_15c0[5] * 14307411.985466668;
  local_608 = (local_608 + dVar66) - dVar139;
  local_600 = local_600 + dVar139;
  dVar140 = dStack_1570 * 20000000.0;
  dVar194 = adStack_15c0[7] * 20000000.0;
  local_d88 = local_d88 - dVar194;
  local_d48 = dVar194 + dVar308 + local_d48;
  dVar173 = dStack_1570 * 1000000.0;
  dVar179 = adStack_15c0[8] * 20000000.0;
  local_e30 = local_e30 - dVar179;
  dVar207 = dVar207 + dVar173;
  auVar29._8_4_ = SUB84(dStack_e48 + dVar179,0);
  auVar29._0_8_ = dVar207;
  auVar29._12_4_ = (int)((ulong)(dStack_e48 + dVar179) >> 0x20);
  local_e18 = local_e18 + dVar173;
  dVar94 = adStack_15c0[4] * -0.5136789314491079;
  local_b90 = local_b90 + dVar94;
  local_b78 = local_b78 - dVar94;
  dVar95 = adStack_15c0[7] * adStack_15c0[8] * 20000000.0 +
           dStack_1548 * adStack_15c0[5] * -1.061382456225949e-08;
  dVar115 = local_1528 * adStack_15c0[5] * 14307411.985466668 +
            adStack_15c0[6] * dStack_1530 * -1826.7180743084757;
  dVar211 = adStack_15c0[7] * dStack_1570 * 20000000.0 +
            local_1540 * adStack_15c0[5] * -22389.705712050265;
  dStack_2f0 = dStack_1570 * adStack_15c0[7] * 1000000.0 +
               dStack_1568 * adStack_15c0[4] * -0.5136789314491079;
  dStack_e48 = auVar29._8_8_;
  local_e20 = (local_e20 - dVar173) - dVar140;
  dVar141 = local_1560 * 54659.06262097068;
  local_e08 = dVar141 + local_e08;
  dVar96 = adStack_15c0[7] * 54659.06262097068;
  dVar142 = adStack_15c0[5] * -0.001452763170659347;
  local_a28 = (local_a28 - dVar169) + dVar142;
  local_a18 = local_a18 - dVar142;
  dVar271 = adStack_15c0[8] * 7980492.798776164;
  local_1040 = local_1040 - dVar271;
  dVar262 = dStack_1558 * -0.001452763170659347;
  dVar270 = local_1550 * -4.547251755334367e-05;
  dStack_f68 = auVar19._8_8_;
  uStack_300 = 0;
  dVar229 = adStack_15c0[4] * adStack_15c0[8] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((dStack_1300 + local_1348) - (dStack_1330 + dStack_1350)) * 0.0006666666666666666) *
            -4.547251755334367e-05 * local_1550 * adStack_15c0[5];
  local_f98 = (((((local_f98 - dVar55) - dVar73) - dVar208) - dVar171) - dVar178) - dVar262;
  dStack_f90 = (((dStack_f90 - dVar218) + dVar132) - dVar171) - dVar270;
  dVar174 = adStack_15c0[4] * 7980492.798776164;
  dVar282 = adStack_15c0[5] * -4.547251755334367e-05;
  dVar239 = dStack_1570 * adStack_15c0[7] * 0.0 +
            (0.0 - ((dStack_1350 + local_1318) - (local_1338 + dStack_1320)) * 0.0006666666666666666
            ) * -0.5136789314491079 * dStack_1568 * adStack_15c0[4];
  dVar244 = adStack_15c0[7] * adStack_15c0[8] * 0.0 +
            (0.0 - ((local_1348 + local_12f8) - (local_1338 + dStack_1330)) * 0.0006666666666666666)
            * -1.061382456225949e-08 * dStack_1548 * adStack_15c0[5];
  dStack_320 = local_3a0 - dVar193;
  dVar284 = ((((dVar303 + local_400) - dVar190) - dVar197) - dVar275) + dVar22 + dVar186 + dVar239;
  dVar293 = (((((((((((((dVar30 + dVar30 +
                         dVar275 + dVar303 + dStack_3f8 + dVar295 + dVar200 + dVar256 + dVar236 +
                                   dVar50 + dVar193) - dVar299) - (dVar232 + dVar232)) - dVar186) -
                    dVar103) - dVar228) - dVar83) - dVar112) - dVar221) - dVar154) - dVar138) -
             dVar300) - dVar172) + dVar244;
  auVar4._8_4_ = SUB84(dVar293,0);
  auVar4._0_8_ = dVar284;
  auVar4._12_4_ = (int)((ulong)dVar293 >> 0x20);
  local_348 = (((local_3c8 - dVar200) - dVar226) - dVar221) + dVar239;
  dStack_330 = local_12c8;
  dStack_3f8 = auVar4._8_8_;
  local_f60 = (((local_f60 - dVar222) + dVar257) - dVar86) + dVar309 + dVar270;
  local_da0 = local_da0 - dVar174;
  local_d98 = ((local_d98 - dVar308) - dVar82) + dVar194 + dVar174;
  local_d50 = dVar174 + dVar160 + local_d50;
  local_978 = (((local_978 + dVar58 + dVar124) - dVar85) - dVar87) + dVar282;
  local_960 = (local_960 - dVar187) - dVar282;
  local_260 = adStack_15c0[2];
  dVar293 = adStack_15c0[8] * adStack_15c0[1] * 99487.69671959426 +
            adStack_15c0[2] * dStack_1570 * -82454.99861437384;
  dVar277 = adStack_15c0[8] * adStack_15c0[1] * 293.5221550217246 +
            (0.0029503362194525 -
            ((dStack_1360 + dStack_1320) - (dStack_1330 + local_1368)) * 0.0006666666666666666) *
            -82454.99861437384 * adStack_15c0[2] * dStack_1570;
  uStack_310 = 0;
  local_298 = local_1518 * -170727.04371112576;
  uStack_290 = 0;
  uStack_2b0 = 0;
  dStack_2d0 = local_1550 * adStack_15c0[5] * -4.547251755334367e-05;
  local_2a8 = local_1328;
  dStack_2a0 = dStack_1320;
  uStack_2c0 = 0;
  dVar315 = (double)CONCAT44(uStack_1574,local_1578);
  dStack_12b0 = adStack_15c0[8] * local_1520;
  local_f8 = dStack_1568;
  uStack_f0 = 0;
  dStack_360 = local_1520 * dVar315;
  dVar212 = adStack_15c0[7] * dStack_1570 * 0.0 +
            local_1540 * adStack_15c0[5] *
            (0.0 - ((dStack_12f0 + local_1348) - (dStack_1320 + local_1338)) * 0.0006666666666666666
            ) * -22389.705712050265;
  dVar220 = dStack_360 * 1645.8767818301812 +
            dStack_12b0 *
            (0.00013419111088125866 -
            ((dStack_1330 + dStack_12d0) - (local_1328 + dStack_12d0)) * 0.0006666666666666666) *
            -284545.07285187626;
  dVar318 = adStack_15c0[1] * 99487.69671959426;
  dVar97 = adStack_15c0[8] * 99487.69671959426;
  local_1250 = local_1250 - dVar97;
  dVar310 = dStack_1570 * -82454.99861437384;
  local_e8 = 0.005278183694662841 -
             ((local_1348 + local_1308) - (dStack_1310 + local_1338)) * 0.0006666666666666666;
  dStack_e0 = 0.00013419111088125866 -
              ((dStack_1330 + local_12c8) - (local_1328 + local_12c8)) * 0.0006666666666666666;
  local_db8 = local_db8 - dVar318;
  dVar175 = adStack_15c0[2] * -82454.99861437384;
  local_338 = (((local_c50 + dVar234) - dVar74) - dVar77) + dVar175;
  local_328 = (local_c20 + dVar135) - dVar175;
  local_12a0 = dVar175 + ((((((dVar107 + (local_c10 - dVar234) + dVar21 + dVar63 + dVar74 + dVar77)
                             - dVar135) - dVar153) + dVar26) - dVar92) - dVar114);
  dVar98 = adStack_15c0[8] * dStack_1570 * 40000000.0 +
           adStack_15c0[2] * local_1538 * -10.82871927173647;
  dVar287 = adStack_15c0[8] * dStack_1570 * 0.0 +
            (0.0 - ((dStack_1360 + local_12e8) - (dStack_1320 + dStack_1330)) *
                   0.0006666666666666666) * -10.82871927173647 * adStack_15c0[2] * local_1538;
  dVar263 = local_1538 * -10.82871927173647;
  adStack_11e0[8] = (((adStack_11e0[8] - dVar104) - dVar81) - dVar310) - dVar263;
  dVar213 = dStack_1570 * 40000000.0;
  local_db0 = local_db0 + dVar160 + dVar308 + dVar318 + dVar213;
  local_d38 = dVar213 + local_d38;
  dVar240 = adStack_15c0[2] * -10.82871927173647;
  local_750 = local_750 - dVar240;
  local_2f8 = 0.003182934144980015 -
              ((dStack_1320 + dStack_1320) - (dStack_1330 + local_1318)) * 0.0006666666666666666;
  dVar305 = dStack_1568 * 345311.0578145205;
  local_d70 = dVar305 + dVar305 + ((dVar318 + (local_d70 - dVar82)) - dVar213);
  local_d68 = local_d68 - dVar305;
  dVar264 = adStack_15c0[7] * local_1560 * 54659.06262097068 +
            dStack_1558 * adStack_15c0[5] * -0.001452763170659347;
  dStack_2d0 = adStack_15c0[4] * adStack_15c0[8] * 7980492.798776164 + dStack_2d0;
  dVar143 = dStack_1570 * -28308.253956378114;
  local_318 = adStack_15c0[8] * 40000000.0;
  dVar288 = adStack_15c0[8] * 345311.0578145205;
  local_308 = dVar315 * 12265169.958139507 + adStack_15c0[8] * -284545.07285187626;
  local_2d8 = local_b70 - dVar288;
  local_350 = (dVar94 + (((local_b58 - dVar235) - dVar75) - dVar168)) - dVar288;
  local_2b8 = local_538;
  local_2c8 = local_540;
  dVar99 = adStack_15c0[2] * adStack_15c0[5] * local_1560;
  dVar195 = dVar315 * local_1518 * 7359101.974883704 +
            adStack_15c0[8] * local_1518 * -170727.04371112576;
  dVar199 = adStack_15c0[4] * dVar315 * 28000000.0 + dVar99 * -7.439703734094493e-10;
  dVar241 = dVar315 * 7359101.974883704 + adStack_15c0[8] * -170727.04371112576;
  dVar176 = adStack_15c0[7] * local_1560 * 288.5005730915626 +
            local_e8 * -0.001452763170659347 * dStack_1558 * adStack_15c0[5];
  dVar180 = dVar315 * local_1518 * 987.5260690981088 +
            dStack_e0 * -170727.04371112576 * adStack_15c0[8] * local_1518;
  dVar265 = dStack_1568 * adStack_15c0[8] * 1099.1023565570054 +
            local_2f8 * -14154.126978189057 * dStack_1570 * dStack_1570;
  dVar100 = dStack_1568 * adStack_15c0[8] * 345311.0578145205 +
            dStack_1570 * dStack_1570 * -14154.126978189057;
  dVar116 = dStack_360 * 12265169.958139507 + dStack_12b0 * -284545.07285187626;
  local_c20 = (local_328 - local_318) - dVar143;
  local_b70 = local_b70 - dVar288;
  local_540 = local_540 + local_308;
  local_538 = local_538 - local_308;
  local_490 = local_490 + dVar241;
  local_488 = local_488 - dVar241;
  dVar99 = adStack_15c0[4] * dVar315 * 0.0 +
           (0.0 - (((dStack_1360 + local_1348 + dStack_1310) - (local_1328 + dStack_1350)) + -1.0) *
                  0.0006666666666666666) * -7.439703734094493e-10 * dVar99;
  dVar311 = adStack_15c0[5] * -7.439703734094493e-10 * local_1560;
  adStack_11e0[4] = ((adStack_11e0[4] - dVar109) + dVar70) - dVar311;
  adStack_11e0[5] =
       (((((dVar237 + dVar237 + dVar159 + adStack_11e0[5] + dVar109 + dVar203) - dVar317) - dVar81)
        - dVar111) - dVar137) + dVar311;
  adStack_11e0[0xc] = dVar311 + ((dVar198 + adStack_11e0[0xc]) - dVar137);
  dVar315 = (double)CONCAT44(uStack_1574,local_1578) * 28000000.0;
  local_1070 = ((local_1070 - dVar319) - dVar316) + dVar315;
  dVar289 = adStack_15c0[2] * -7.439703734094493e-10 * local_1560;
  local_fc0 = dVar101 + dVar113 + dVar289;
  local_f88 = ((local_f88 - local_1658) + dVar151) - dVar289;
  dStack_f68 = dStack_f68 + dVar262;
  local_f70 = dVar289 + (dVar242 - dVar262);
  dVar301 = adStack_15c0[4] * 28000000.0;
  local_ce8 = ((local_ce8 - dVar118) - dVar134) + dVar301;
  dVar196 = adStack_15c0[2] * -7.439703734094493e-10 * adStack_15c0[5];
  local_af0 = (local_af0 - dVar164) + dVar210 + dVar196;
  local_ad8 = (((local_ad8 + dVar57) - dVar210) - dVar219) + dVar96 + dVar196;
  dVar101 = (double)CONCAT44(uStack_1574,local_1578) * adStack_15c0[4];
  dVar312 = dVar101 * 12000000.0 + adStack_15c0[6] * local_1560 * -2.2921694105207742e-20;
  dVar241 = dVar101 * 0.0 +
            (0.0 - ((dStack_1340 + dStack_1310) - (dStack_1350 + local_1328)) *
                   0.0006666666666666666) * -2.2921694105207742e-20 * adStack_15c0[6] * local_1560;
  local_1508[5] =
       dVar170 + dVar215 + dVar205 + local_1508[5] + dVar80 + dVar167 + dVar177 + dVar136 + dVar238
       + dVar115 + dVar312;
  dVar101 = (double)CONCAT44(uStack_1574,local_1578);
  dVar144 = dVar101 * 12000000.0;
  local_1050 = local_1050 + dVar283 + dVar144;
  local_1038 = (local_1038 - dVar315) - dVar144;
  dVar302 = local_1560 * -2.2921694105207742e-20;
  local_f00 = auVar28._8_8_;
  local_f00 = local_f00 - dVar302;
  dStack_f08 = dStack_f08 + dVar214;
  local_ef0 = dVar131 + local_ef0 + dVar214 + dVar117 + dVar133 + dVar152 + dVar276 + dVar209 +
              dVar33 + dVar89 + dVar302;
  local_ec0 = dVar302 + local_ec0 + dVar209;
  dVar290 = adStack_15c0[4] * 12000000.0;
  local_cf0 = (local_cf0 - dVar301) - dVar290;
  local_ce0 = local_ce0 + dVar134 + dVar290;
  dVar278 = adStack_15c0[6] * -2.2921694105207742e-20;
  local_ad0 = local_ad0 + dVar219 + dVar278;
  local_3f0 = dVar232 + dVar299 + local_3f0 + dVar186 + dVar83 + dVar112 + dVar221 + dVar138 +
              dVar300 + dVar172 + dVar241;
  dVar209 = adStack_15c0[1] * dVar101 * 70000000.0 +
            adStack_15c0[2] * dStack_1570 * -1345932.1015318723;
  local_1508[0] =
       ((((local_1508[0] - dVar294) + dVar72 + dVar128 + dVar150 + dVar31 + dVar25) - dVar205) -
       dVar293) - dVar209;
  dVar214 = dVar101 * 70000000.0;
  local_1288[0] =
       ((((local_1288[0] - dVar54) + dVar102 + dVar286 + dVar291 + dVar202 + dVar204) - dVar79) -
       dVar97) - dVar214;
  local_1288[1] =
       ((((((local_1288[1] + dVar54) - dVar102) - dVar286) - dVar291) - dVar202) - dVar204) + dVar79
       + dVar97 + dVar214;
  local_1248 = local_1248 - dVar214;
  local_1240 = dVar214 + dVar97 + local_1240 + dVar286;
  dVar54 = dStack_1570 * -1345932.1015318723;
  adStack_11e0[1] =
       ((((adStack_11e0[1] - dVar159) + dVar70 + dVar192 + dVar198 + dVar260 + dVar156) - dVar317) -
       dVar310) - dVar54;
  dVar204 = adStack_15c0[1] * 70000000.0;
  local_d08 = local_d08 - dVar204;
  dVar89 = adStack_15c0[1] * dVar101 * 0.0 +
           (0.0 - ((dStack_1360 + dStack_1320) - (local_1328 + local_1368)) * 0.0006666666666666666)
           * -1345932.1015318723 * adStack_15c0[2] * dStack_1570;
  dVar214 = adStack_15c0[2] * -1345932.1015318723;
  local_c58 = ((local_c58 + dVar74) - dVar175) - dVar214;
  local_418 = ((((local_418 - dVar295) + dVar22 + dVar226 + dVar231 + dVar129 + dVar78) - dVar299) -
              dVar277) - dVar89;
  dVar101 = (double)CONCAT44(uStack_1574,local_1578);
  dVar79 = adStack_15c0[6] * dVar101 * 30000000.0 +
           adStack_15c0[6] * adStack_15c0[8] * -695983.1958864406;
  dVar97 = adStack_15c0[6] * dVar101 * 0.0 +
           (0.0 - ((dStack_1340 + dStack_1330) - (dStack_1340 + local_1328)) * 0.0006666666666666666
           ) * -695983.1958864406 * adStack_15c0[6] * adStack_15c0[8];
  dVar242 = dVar101 * 30000000.0 + adStack_15c0[8] * -695983.1958864406;
  local_ee0 = local_ee0 + dVar133 + dVar242;
  dStack_ed8 = ((dStack_ed8 + dVar152) - dVar302) - dVar242;
  dVar302 = dVar101 * dStack_1570 * 14528743.285075013 +
            adStack_15c0[2] * local_1538 * -0.09124785266815053;
  dVar133 = dVar101 * dStack_1570 * -1852.146791076201 +
            (-0.00012748155533719572 -
            ((dStack_1360 + local_12e8) - (local_1328 + dStack_1320)) * 0.0006666666666666666) *
            -0.09124785266815053 * adStack_15c0[2] * local_1538;
  dVar101 = local_1538 * -0.09124785266815053;
  adStack_11e0[9] = ((((adStack_11e0[9] - dVar119) - dVar111) - dVar311) - dVar54) - dVar101;
  adStack_11e0[0x11] = dVar101 + dVar263 + adStack_11e0[0x11];
  dVar242 = dStack_1570 * 14528743.285075013;
  local_d00 = local_d00 + dVar105 + dVar118 + dVar301 + dVar204 + dVar242;
  local_c88 = dVar242 + local_c88;
  dVar102 = (double)CONCAT44(uStack_1574,local_1578);
  dVar276 = dVar102 * 14528743.285075013;
  local_bd8 = dVar276 + (local_bd8 - dVar63) + local_318;
  dVar33 = adStack_15c0[2] * -0.09124785266815053;
  local_780 = local_780 + dVar240 + dVar33;
  local_748 = local_748 - dVar33;
  dStack_740 = ((dStack_740 + dVar62) - dVar240) - dVar33;
  dVar286 = dVar102 * dStack_1568 * 19371657.71343335 +
            dStack_1570 * dStack_1570 * -18421.156298117476;
  dVar131 = dVar102 * dStack_1568 * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((dStack_1320 + dStack_1320) - (local_1318 + local_1328)) * 0.0006666666666666666) *
            -18421.156298117476 * dStack_1570 * dStack_1570;
  dVar202 = dStack_1570 * -36842.31259623495;
  dStack_c18 = (((dStack_c18 + dVar153) - dVar214) - dVar276) - dVar202;
  dVar152 = dVar102 * 19371657.71343335;
  local_b68 = local_b68 - dVar152;
  dVar117 = (double)CONCAT44(uStack_1574,local_1578);
  dVar175 = dVar117 * 9000000.0 + adStack_15c0[8] * -208794.958765932;
  local_ac0 = local_ac0 + dVar175;
  dVar291 = dVar117 * 7000000.0 + adStack_15c0[8] * -162396.0790401699;
  local_a10 = local_a10 + dVar291;
  dVar313 = dStack_1548 * -0.006485071999156734;
  local_ab8 = (((local_ab8 - dVar196) - dVar278) - dVar175) - dVar313;
  dStack_a98 = (dVar96 + dVar210 + dVar67 + dStack_a98) - dVar313;
  local_a88 = dVar313 + local_a88;
  dVar175 = (double)CONCAT44(uStack_1574,local_1578) * 14000000.0;
  local_a08 = (local_a08 - dVar291) - dVar175;
  local_9f0 = (((local_9f0 - dVar162) - dVar169) - dVar142) + dVar175;
  local_9e8 = (dVar142 + dVar169 + dVar162 + local_9e8 + dVar123) - dVar175;
  local_9d8 = dVar175 + local_9d8;
  dVar142 = local_1560 * -0.006485071999156734;
  dStack_8a8 = (dStack_8a8 - dVar269) - dVar142;
  local_890 = local_890 + dVar142;
  local_888 = local_888 - dVar142;
  dVar123 = dVar102 * local_1560 * 9000000.0 + local_1560 * adStack_15c0[8] * -208794.958765932;
  dVar175 = dVar102 * local_1560 * 0.0 +
            (0.0 - ((dStack_1310 + dStack_1330) - (local_1328 + dStack_1310)) *
                   0.0006666666666666666) * -208794.958765932 * local_1560 * adStack_15c0[8];
  dStack_d80 = ((((((((dStack_d80 - dVar160) - dVar308) + dVar82) - dVar194) - dVar174) - dVar318) -
                dVar213) - dVar305) + local_1520 * -284545.07285187626 + local_298 +
               adStack_15c0[6] * -695983.1958864406 + local_1560 * -208794.958765932 +
               dStack_1558 * -162396.0790401699;
  local_d78 = ((((local_d78 - local_1520 * -284545.07285187626) - local_298) -
               adStack_15c0[6] * -695983.1958864406) - local_1560 * -208794.958765932) -
              dStack_1558 * -162396.0790401699;
  dVar117 = dVar117 * dStack_1558;
  local_cd0 = adStack_15c0[6] * 30000000.0 +
              local_1520 * 12265169.958139507 + local_cd0 + local_1518 * 7359101.974883704 +
              local_1560 * 9000000.0 + dStack_1558 * 7000000.0;
  dVar305 = dVar117 * 0.0 +
            (0.0 - ((local_12f8 + dStack_1310) - (local_1308 + local_1328)) * 0.0006666666666666666)
            * -0.006485071999156734 * dStack_1548 * local_1560;
  dVar102 = dVar117 * 0.0 +
            (0.0 - ((dStack_1330 + local_1308) - (local_1308 + local_1328)) * 0.0006666666666666666)
            * -162396.0790401699 * adStack_15c0[8] * dStack_1558;
  dVar82 = dVar117 * 14000000.0 + dStack_1548 * local_1560 * -0.006485071999156734;
  dVar117 = dVar117 * 7000000.0 + adStack_15c0[8] * dStack_1558 * -162396.0790401699;
  local_1508[7] =
       dVar79 + ((((((dVar167 + ((local_1508[7] - dVar266) - dVar110)) - dVar95) - dStack_2d0) -
                  dVar293) - dVar98) - dVar100) + dVar116 + dVar195 + dVar123 + dVar117;
  local_1508[8] =
       (((((((((((dVar177 + ((local_1508[8] - dVar273) - dVar32)) - dVar116) - dVar195) - dVar199) -
             dVar312) - dVar209) - dVar79) - dVar302) - dVar286) - dVar123) - dVar117) - dVar82;
  local_1508[0xc] = (dVar314 + local_1508[0xc] + dVar259 + dVar243 + dVar264) - dVar82;
  dVar117 = dStack_1568 * 19371657.71343335;
  dVar79 = dStack_1558 * 14000000.0;
  local_cc0 = dVar117 + dVar117 + ((dVar204 + (local_cc0 - dVar134)) - dVar242);
  local_cc8 = (((((((((((((local_cc8 - dVar105) - dVar118) + dVar134) -
                       local_1520 * 12265169.958139507) - local_1518 * 7359101.974883704) - dVar301)
                    - dVar290) - dVar204) - adStack_15c0[6] * 30000000.0) - dVar242) - dVar117) -
               local_1560 * 9000000.0) - dStack_1558 * 7000000.0) - dVar79;
  dVar242 = dVar79 + dVar290 + dVar301 + (double)local_cb8._8_8_;
  local_cb8._8_4_ = SUB84(dVar242,0);
  local_cb8._0_8_ = (double)local_cb8._0_8_ - dVar117;
  local_cb8._12_4_ = (int)((ulong)dVar242 >> 0x20);
  local_ca8 = local_ca8 - dVar79;
  local_c98 = dVar79 + dVar118 + local_c98;
  dStack_3e0 = dVar97 + ((((((dVar83 + ((dStack_3e0 - dVar145) - dVar103)) - dVar244) - dVar229) -
                          dVar277) - dVar287) - dVar265) + dVar220 + dVar180 + dVar175 + dVar102;
  local_3d8 = ((((((((((local_1298 - dVar220) - dVar180) - dVar99) - dVar241) - dVar89) - dVar97) -
                 dVar133) - dVar131) - dVar175) - dVar102) - dVar305;
  dStack_3b8 = (dVar176 + local_2e8) - dVar305;
  dVar242 = local_1540 * -86596485.19199125;
  local_1120._8_8_ =
       dVar225 + (((((((((((((double)local_1120._8_8_ - dVar53) - dVar272) - dVar279) - dVar285) -
                        dVar189) - dVar122) - dVar148) - dVar274) - dVar281) - dVar224) - dVar230) -
                 dVar108) + dVar69 + dVar253 + dVar242;
  local_1120._0_8_ =
       ((double)local_1120._0_8_ + dVar53 + dVar279 + dVar285 + dVar189 + dVar274) - dVar225;
  dStack_1108 = dStack_1108 - (dVar253 + dVar253);
  local_1110 = dVar216 - dVar242;
  local_10e0 = ((local_10e0 - dVar189) + dVar122 + dVar224 + dVar230) - dVar242;
  local_10b0 = dVar242 + local_10b0;
  dVar97 = adStack_15c0[4] * dStack_1570 * 1793.8203338395704 +
           adStack_15c0[5] * dStack_1548 * -4.52122891906719e-05;
  dVar242 = adStack_15c0[4] * dStack_1570 * 3.5866496754579007 +
            (0.001999447552130754 -
            ((local_12f8 + local_1348) - (dStack_1320 + dStack_1350)) * 0.0006666666666666666) *
            -4.52122891906719e-05 * adStack_15c0[5] * dStack_1548;
  local_1508[4] =
       (((((((((((((dVar23 + dVar23 +
                    dVar71 + dVar255 + dVar294 + local_1508[4] + dVar296 + dVar306 + dVar223 +
                             dVar297 + dVar24) - dVar205) - (dVar215 + dVar215)) - dVar80) - dVar110
               ) - dVar32) - dVar167) - dVar177) - dVar136) - dVar243) - dVar238) - dVar170) -
       dVar115) + dVar95 + dVar211 + dVar264 + dStack_2d0 + dVar199 + dVar97;
  dVar117 = dStack_1570 * 1793.8203338395704;
  dVar118 = dStack_1570 * 1703.2356556327686;
  local_1068 = dVar319 + (local_1068 - dVar155) + dVar126 + dVar118;
  local_1030 = ((local_1030 - dVar91) - dVar118) - dVar117;
  dVar53 = dStack_1548 * -4.52122891906719e-05;
  local_fb0 = (((((dVar55 + local_fb0) - dVar127) + dVar208) - dVar270) - dVar289) - dVar53;
  dStack_fa8 = dVar270 + (((((((((((((dVar73 + dVar73 +
                                      dVar55 + dVar157 + dStack_fa8 + dVar146 + dVar222 + dVar257 +
                                      dVar161 + dVar127 + dVar120) - dVar227) - (dVar304 + dVar304))
                                  - dVar208) - dVar218) - local_1658) - dVar132) - dVar151) - dVar84
                             ) - dVar113) - dVar86) - dVar309) - dVar88) + dVar171 + dVar178 +
                         dVar262 + dVar289 + dVar53;
  local_f80 = (((((local_f80 + dVar146 + dVar120) - dVar132) - dVar151) + dVar84) - dVar178) -
              dVar53;
  local_f58 = dVar53 + ((local_1658 + (local_f58 - dVar257) + dVar218) - dVar309) + dVar171;
  dVar73 = adStack_15c0[4] * 1793.8203338395704;
  dStack_c38 = ((((dStack_c38 + dVar21 + dVar77) - dVar135) - dVar153) - dVar26) + dVar114 + dVar73;
  adStack_15c0[5] = adStack_15c0[5] * -4.52122891906719e-05;
  local_8c8 = ((((local_8c8 + dVar60) - dVar261) - dVar269) - dVar254) + dVar90 + adStack_15c0[5];
  dVar53 = dStack_1530 * -159545083.58041438;
  adStack_11e0[2] =
       (((((((((local_1678 + dVar159 + dVar104 + dVar119 + dVar188 + dVar59) - dVar109) - dVar70) -
            dVar237) - dVar192) - dVar198) - dVar260) - dVar203) - dVar156) + dVar317 + dVar81 +
       dVar111 + dVar137 + dVar310 + dVar263 + dVar311 + dVar54 + dVar101 + dVar53;
  adStack_11e0[10] =
       ((dVar54 + ((dVar310 + (adStack_11e0[10] - dVar188) + dVar192 + dVar203) - dVar263)) -
       dVar101) - (dVar53 + dVar53);
  adStack_11e0[0x12] = dVar53 + adStack_11e0[0x12] + dVar156;
  dVar53 = dStack_1570 * 592052.8885504483;
  dVar101 = adStack_15c0[4] * 1703.2356556327686;
  local_be0 = dVar101 + (local_be0 - dVar77) + dVar114;
  local_c40 = ((local_c40 + dVar92) - dVar101) - dVar73;
  local_c50 = local_338 + local_318 + dVar214 + dVar276 + dVar53;
  dStack_c48 = ((((dStack_c48 - dVar234) - dVar21) - dVar63) - dVar107) + dVar101;
  dVar120 = adStack_15c0[3] * -86596485.19199125;
  dVar69 = adStack_15c0[2] * -159545083.58041438;
  local_828 = local_828 + dVar120;
  local_7f0 = ((local_7f0 + dVar165) - dVar93) - dVar120;
  dVar102 = dStack_1570 * dStack_1570 * 721.5278371512255 +
            (0.00243737629223557 -
            ((dStack_1360 + dStack_12e0) - (dStack_1320 + dStack_1320)) * 0.0006666666666666666) *
            -159545083.58041438 * dStack_1530 * adStack_15c0[2];
  dVar119 = adStack_15c0[4] * dStack_1570 * 10.970836066652648 +
            (0.006441173322300416 -
            ((dStack_12f0 + local_1358) - (dStack_1320 + dStack_1350)) * 0.0006666666666666666) *
            -86596485.19199125 * local_1540 * adStack_15c0[3];
  dVar156 = dVar242 + dVar244 + ((dVar103 + (((((dVar147 + dStack_3a8) - dVar236) + dVar149) -
                                             dVar197) - dVar129) + dVar228) - dVar300) + dVar305;
  dVar253 = dVar119 + dVar212 + (local_3a0 - dVar193);
  auVar5._8_4_ = SUB84(dVar253,0);
  auVar5._0_8_ = dVar156;
  auVar5._12_4_ = (int)((ulong)dVar253 >> 0x20);
  dVar81 = dStack_1570 * dStack_1570 * 296026.4442752242 +
           dStack_1530 * adStack_15c0[2] * -159545083.58041438;
  dVar84 = adStack_15c0[4] * dStack_1570 * 1703.2356556327686 +
           local_1540 * adStack_15c0[3] * -86596485.19199125;
  local_1508[1] =
       (((((((((local_1508[1] + dVar294 + dVar266 + dVar273 + dVar280 + dVar314) - dVar71) - dVar72)
            - dVar23) - dVar128) - dVar150) - dVar31) - dVar24) - dVar25) + dVar205 + dVar110 +
       dVar32 + dVar243 + dVar293 + dVar98 + dVar199 + dVar209 + dVar302 + dVar81;
  local_1508[2] =
       ((((((((((((local_1508[2] - dVar294) - dVar255) - dVar266) - dVar273) - dVar280) - dVar296) -
            dVar306) - dVar314) - dVar223) - dVar201) - dVar217) - dVar297) + dVar259 + dVar71 +
       dVar215 + dVar84;
  local_368 = dVar81 + dVar115 + ((double)local_1480._0_8_ - dVar217) + dVar297 + dVar25;
  local_6d0 = (local_6d0 - dVar130) + dVar69;
  local_410._8_8_ =
       (((((((((((((double)local_410._8_8_ - dVar295) - dVar303) - dVar145) - dVar121) - dVar147) -
             dVar200) - dVar256) - dVar267) - dVar236) - dVar125) - dVar149) - dVar50) + dVar190 +
       dVar275 + dVar232 + dVar119;
  local_410._0_8_ =
       ((((((((((double)local_410._0_8_ + dVar185 + dVar295 + dVar145 + dVar121 + dVar147 + dVar267)
              - dVar275) - dVar22) - dVar30) - dVar226) - dVar231) - dVar129) - dVar193) - dVar78) +
       dVar299 + dVar103 + dVar228 + dVar154 + dVar277 + dVar287 + dVar99 + dVar89 + dVar133 +
       dVar102;
  dVar77 = dStack_1570 * local_1550 * 26480000.0 + dStack_1568 * local_1560 * -0.0002710754168835943
  ;
  dVar79 = dStack_1570 * local_1550 * 0.0 +
           (0.0 - ((dStack_1310 + local_1318) - (dStack_1320 + dStack_1300)) * 0.0006666666666666666
           ) * -0.0002710754168835943 * dStack_1568 * local_1560;
  dVar70 = local_1550 * 26480000.0;
  local_c00 = local_c00 + dVar70;
  dVar145 = local_1560 * -0.0002710754168835943;
  local_b50 = local_b50 + dVar145;
  dVar253 = dStack_1568 * -0.0002710754168835943;
  local_ab0 = local_ab0 - dVar253;
  local_aa8 = dVar253 + local_aa8;
  dVar215 = dStack_1548 * 390998.5057150522;
  local_bf0 = ((local_bf0 + dVar63) - dVar70) + dVar215;
  dStack_be8 = (dVar73 + dVar234 + dStack_be8 + dVar107) - dVar215;
  dVar55 = local_1550 * -2156.4740241498666;
  local_b40 = (local_b40 - dVar145) + dVar55;
  local_b38 = local_b38 - dVar55;
  dVar216 = dStack_1570 * 26480000.0;
  dVar59 = dStack_1568 * -2156.4740241498666;
  dVar63 = dStack_1548 * dStack_1570 * 390998.5057150522 +
           dStack_1568 * local_1550 * -2156.4740241498666;
  dVar146 = dStack_1548 * dStack_1570 * 1244.9131168262245 +
            (0.003183933182940293 -
            ((local_1318 + dStack_1300) - (dStack_1320 + local_12f8)) * 0.0006666666666666666) *
            -2156.4740241498666 * dStack_1568 * local_1550;
  local_950 = ((local_950 + dVar61) - dVar216) - dVar59;
  local_948 = dVar59 + local_948 + dVar216;
  local_928 = ((((local_928 - dVar124) - dVar51) - dVar298) - dVar87) - dVar59;
  dVar54 = dStack_1570 * 390998.5057150522;
  local_8a0 = (((local_8a0 - dVar56) + dVar64) - adStack_15c0[5]) - dVar54;
  local_898 = local_898 + dVar54;
  local_880 = local_880 + dVar60 + dVar68 + dVar76 + dVar254 + dVar54;
  local_3a0 = auVar5._8_8_;
  dVar103 = dStack_1568 * -5603.460820379699;
  local_690 = ((local_690 + dVar65) - (dVar69 + dVar69)) - dVar103;
  local_688 = local_688 + dVar103;
  local_648 = (((local_648 - dVar258) - dVar130) - dVar27) - dVar103;
  dVar104 = adStack_15c0[4] * 1923289.8439964922;
  dVar105 = dStack_1570 * 61950.158398051455;
  local_5e0 = local_5e0 - dVar105;
  local_5d8 = local_5d8 + dVar105;
  local_5a0 = local_5a0 + dVar66 + dVar166 + dVar139 + dVar105;
  local_598 = (((local_598 - dVar66) - dVar166) - dVar139) - dVar105;
  dVar105 = adStack_15c0[7] * -132.4388903689313;
  local_ae0 = (((local_ae0 - dVar67) - dVar196) - dVar278) - dVar105;
  local_ac8 = (local_ac8 - dVar96) + dVar105;
  dStack_aa0 = dVar253 + dVar278 + dVar196 + ((dVar219 +
                                              ((((dStack_aa0 + dVar57) - dVar67) + dVar164) -
                                              dVar210)) - dVar96) + dVar313 + dVar105;
  dStack_a90 = ((((dStack_a90 - dVar57) - dVar164) - dVar219) - dVar253) - dVar105;
  dVar253 = adStack_15c0[4] * 6645614.320408218;
  local_980 = ((local_980 - dVar51) - dVar282) - dVar253;
  local_968 = local_968 + dVar51 + dVar253;
  dStack_940 = dVar216 + dStack_940 + dVar58 + dVar307 + dVar85 + dVar253;
  local_930 = (((dVar282 +
                (((((((dVar233 + dVar187 + local_930) - dVar58) - dVar58) + dVar124 + dVar61 +
                   dVar51) - dVar307) + dVar298) - dVar85) + dVar87) - dVar216) + dVar59) - dVar253;
  dVar105 = adStack_15c0[4] * local_1550 * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((dStack_1310 + local_1338) - (dStack_1300 + dStack_1350)) * 0.0006666666666666666) *
            -132.4388903689313 * adStack_15c0[7] * local_1560;
  dVar216 = local_1540 * adStack_15c0[4] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((local_12f8 + local_1338) - (dStack_12f0 + dStack_1350)) * 0.0006666666666666666) *
            -43.301595906050935 * dStack_1548 * adStack_15c0[7];
  dVar51 = local_1550 * 6645614.320408218;
  dVar253 = local_1540 * 1923289.8439964922;
  local_1020 = dVar144 + dVar315 + (local_1020 - dVar126) + dVar51;
  local_1010 = (dVar271 + local_1010 + dVar49) - dVar51;
  dStack_1008 = dVar253 + (dStack_1008 - dVar49) + dVar117;
  local_12b8 = (((((dStack_1048 - dVar155) + dVar49) - dVar316) - dVar283) - dVar91) + dVar51 +
               dVar253;
  dStack_1000 = (dStack_1000 + dVar118) - dVar253;
  dVar283 = local_1560 * -132.4388903689313;
  dVar282 = dStack_1548 * -43.301595906050935;
  local_e10 = (local_e10 - dVar141) + dVar283;
  local_e00 = (local_e00 + dVar163) - dVar283;
  dStack_df8 = dVar282 + dVar179 + (dStack_df8 - dVar163);
  dStack_df0 = (dVar140 + dStack_df0) - dVar282;
  dVar155 = adStack_15c0[7] * -43.301595906050935;
  local_8d0 = ((local_8d0 - dVar68) - adStack_15c0[5]) - dVar155;
  local_8b8 = ((local_8b8 + dVar68) - dVar90) + dVar155;
  local_878 = ((adStack_15c0[5] +
               dVar142 + dVar90 + ((dVar269 +
                                   (((((dVar56 + local_878) - dVar60) + dVar64) - dVar68) - dVar76)
                                   + dVar261) - dVar254)) - dVar54) + dVar155;
  local_870 = local_870 - dVar155;
  local_820 = (local_820 - dVar120) - dVar104;
  local_808 = (local_808 - dVar93) + dVar104;
  local_7c8 = local_7c8 + dVar104;
  local_7c0 = (dVar120 + dVar93 + (local_7c0 - dVar165)) - dVar104;
  dStack_3c0 = dVar241 + dVar99 + ((((dVar231 + ((dStack_3c0 + dVar185 + dVar256) - dVar190)) -
                                    dVar154) + dVar138) - dVar176) + dVar305 + dVar79 + dVar105;
  dVar49 = adStack_15c0[4] * local_1550 * 6645614.320408218 +
           adStack_15c0[7] * local_1560 * -132.4388903689313;
  dVar120 = local_1540 * adStack_15c0[4] * 1923289.8439964922 +
            dStack_1548 * adStack_15c0[7] * -43.301595906050935;
  local_1508[0xb] =
       dVar312 + ((((dVar150 + ((dVar306 + local_1508[0xb]) - dVar259)) - dVar243) + dVar238) -
                 dVar264) + dVar199 + dVar82 + dVar77 + dVar49;
  local_1508[0xd] =
       (((((((dVar201 + (((dVar273 + local_1508[0xd] + dVar266) - dVar306) - dVar314) + dVar223 +
             dVar268) - dVar150) + dVar31) - dVar238) + dVar170 + dStack_2d0) - dVar77) + dVar63) -
       dVar49;
  local_1508[0xe] =
       dVar120 + ((dVar97 + dVar82 + ((dVar32 + (((dVar217 + ((dVar280 + local_1508[0xe]) - dVar223)
                                                  ) - dVar268) - dVar31) + dVar110) - dVar170) +
                                     dVar95) - dVar63);
  local_1508[0xf] = (dVar84 + dVar211 + (local_1508[0xf] - dVar24)) - dVar120;
  dStack_3b0 = (((dVar229 + dStack_2e0) - dVar79) + dVar146) - dVar105;
  local_3a0 = local_3a0 - dVar216;
  dStack_3a8 = dVar216 + (dVar156 - dVar146);
  dVar185 = adStack_15c0[7] * -5461.432196104055;
  local_770 = local_770 - dVar185;
  local_758 = local_758 + dVar185;
  local_708 = dVar33 + dVar240 + (local_708 - dVar62) + dVar185;
  local_700 = local_700 - dVar185;
  dVar156 = adStack_15c0[4] * 228932.11193603993;
  local_6c0 = local_6c0 - dVar156;
  dVar185 = local_1528 * 61950.158398051455;
  local_c10 = ((((((dVar202 + dVar202 +
                   ((dVar214 + dVar143 + dVar143 + (local_12a0 - local_318)) - dVar276)) - dVar101)
                 - dVar73) - (dVar53 + dVar53)) - dVar70) - dVar215) - dVar185;
  local_c08 = ((((((local_c08 - dVar21) - dVar74) - dVar26) + dVar92) - dVar143) - dVar202) + dVar70
              + dVar215 + dVar185;
  dStack_bd0 = (dStack_bd0 - dVar107) + dVar53 + dVar185;
  local_bc8 = local_bc8 - dVar185;
  dVar53 = dStack_1530 * -5603.460820379699;
  local_b60 = (((dVar152 + dVar152 +
                dVar288 + dVar288 + ((local_b60 + dVar235 + dVar75 + dVar168) - dVar94)) - dVar145)
              - dVar55) - dVar53;
  local_b58 = (local_350 - dVar152) + dVar145 + dVar55 + dVar53;
  local_b20 = local_b20 + dVar53;
  local_b18 = local_b18 - dVar53;
  dVar185 = adStack_15c0[4] * dStack_1530 * 198.4042264437053 +
            (0.0008666509244414622 -
            ((local_1338 + local_12e8) - (dStack_12e0 + dStack_1350)) * 0.0006666666666666666) *
            -5461.432196104055 * adStack_15c0[7] * local_1538;
  dVar155 = dStack_1570 * local_1528 * 216.6497304178424 +
            (0.0034971618478485886 -
            ((local_1318 + dStack_12e0) - (local_12d8 + dStack_1320)) * 0.0006666666666666666) *
            -5603.460820379699 * dStack_1568 * dStack_1530;
  local_3d0 = ((((((dVar131 + dVar131 +
                   ((dVar89 + dVar265 + dVar265 +
                              ((dVar277 +
                               (((((((local_3d0 - dVar147) + dVar200 + dVar125 + dVar149 + dVar226 +
                                    dVar193) - dVar83) - dVar112) + dVar221) - dVar239) - dVar212))
                              - dVar287)) - dVar133)) - dVar119) - dVar242) - (dVar102 + dVar102)) -
               dVar79) - dVar146) - dVar155;
  local_3c8 = ((local_348 - dVar265) - dVar131) + dVar79 + dVar146 + dVar155;
  dVar221 = adStack_15c0[4] * dStack_1530 * 228932.11193603993 +
            adStack_15c0[7] * local_1538 * -5461.432196104055;
  dVar254 = dStack_1570 * local_1528 * 61950.158398051455 +
            dStack_1568 * dStack_1530 * -5603.460820379699;
  local_1508[9] =
       ((((((dVar286 + dVar286 +
            ((dVar209 +
             dVar100 + dVar100 +
             (((((((((local_1508[9] - dVar280) + dVar296 + dVar201 + dVar217 + dVar128 + dVar24) -
                   dVar167) - dVar177) + dVar136) - dStack_2f0) - dVar211) + dVar293) - dVar98)) -
            dVar302)) - dVar84) - dVar97) - (dVar81 + dVar81)) - dVar77) - dVar63) - dVar254;
  local_1508[10] =
       ((((((local_1508[10] - dVar296) - dVar128) - dVar136) + dStack_2f0) - dVar100) - dVar286) +
       dVar77 + dVar63 + dVar254;
  local_1508[3] =
       ((((((((((((dVar255 + local_1508[3]) - dVar259) - dVar268) - dVar71) + dVar72 + dVar80 +
              dStack_2f0) - dStack_2d0) - dVar199) - dVar312) - dVar84) - dVar97) - dVar49) -
       dVar120) - dVar221;
  local_1508[6] =
       (((((((((local_1508[6] - dVar255) + dVar268) - dVar72) - dVar23) - dVar80) - dVar95) -
         dStack_2f0) - dVar211) - dVar264) + dVar49 + dVar120 + dVar221;
  local_1508[0x10] = dVar302 + dVar98 + (local_1508[0x10] - dVar201) + dVar221;
  dVar53 = ((((double)local_1480._8_8_ - dVar297) - dVar25) - dVar115) - dVar254;
  local_1480._8_4_ = SUB84(dVar53,0);
  local_1480._0_8_ = (dVar254 + local_368) - dVar221;
  local_1480._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_1530 = dStack_1530 * 228932.11193603993;
  dStack_1058 = dStack_1058 + dVar271 + dVar315 + dVar117;
  dStack_1060 = ((((((((dVar292 + dVar91) - dVar271) - dVar315) - dVar144) - dVar118) - dVar117) -
                 dVar51) - dVar253) - dStack_1530;
  dStack_1048 = local_12b8 + dStack_1530;
  local_ff8 = local_ff8 + dStack_1530;
  local_ff0 = local_ff0 - dStack_1530;
  local_1538 = local_1538 * -5461.432196104055;
  dStack_e48 = dStack_e48 + dVar140 + dVar141;
  local_e50 = ((dVar207 - dVar283) - dVar282) - local_1538;
  dStack_e38 = (((((((((dStack_e38 - dVar158) + dVar163) - dVar52) - dVar191) - dVar206) - dVar179)
                 - dVar173) - dVar140) - dVar141) + dVar283 + dVar282 + local_1538;
  local_de8 = local_de8 + local_1538;
  local_de0 = local_de0 - local_1538;
  local_6a8 = local_6a8 + dVar156;
  local_658 = local_658 + dVar156;
  local_650 = ((local_650 - dVar65) + dVar258 + dVar130 + dVar27 + dVar69 + dVar103) - dVar156;
  dStack_3f8 = dStack_3f8 + dVar212 + dVar176 + dVar229 + dVar99 + dVar242;
  local_400 = (((((((dVar284 - dVar229) - dVar99) - dVar241) - dVar119) - dVar242) - dVar105) -
              dVar216) - dVar185;
  local_3e8 = (((((((((local_3e8 - dVar303) + dVar197) - dVar22) - dVar30) - dVar186) - dVar244) -
                dVar239) - dVar212) - dVar176) + dVar105 + dVar216 + dVar185;
  local_398 = dVar133 + dVar287 + (local_398 - dVar125) + dVar185;
  local_390 = (dVar155 + (local_390 - dVar149) + dVar50 + dVar78 + dVar172 + dVar102) - dVar185;
  dStack_388 = (((dStack_388 - dVar50) - dVar78) - dVar172) - dVar155;
  if (iVar36 == 0) {
    local_258[0] = 2.8822959451999997;
    local_258[1] = 1.4999999982659773;
    local_258[2] = 1.507252090419375;
    local_258[3] = 3.398993884662499;
    local_258[4] = 2.9627907471999997;
    local_258[5] = 4.687841430575;
    local_258[6] = 5.2821630604062495;
    local_258[7] = 4.97163097458125;
    local_258[8] = 4.98750050771875;
    local_258[9] = 7.198434206537501;
    local_258[10] = 9.874274296874997;
    local_258[0xb] = 3.2349510160250006;
    local_258[0xc] = 6.023470866475001;
    local_258[0xd] = 5.33591319330625;
    local_258[0xe] = 7.5590570047500005;
    local_258[0xf] = 9.825474777499998;
    local_258[0x10] = 12.2373674399375;
    local_258[0x11] = 14.246951215250002;
    local_258[0x12] = 16.552933378125;
    local_258[0x13] = 3.1861203930625;
    local_258[0x14] = 1.5;
    local_1a8[0] = 0.000507239459;
    local_1a8[1] = 1.4767295125000317e-13;
    local_1a8[2] = -1.116620304e-05;
    local_1a8[3] = 0.00033054475434999984;
    local_1a8[4] = 0.0004928155568499999;
    local_1a8[5] = 0.0012567384129500002;
    local_1a8[6] = 0.0009643321552500001;
    local_1a8[7] = 0.0009323347502999997;
    local_1a8[8] = 0.0009823763672500007;
    local_1a8[9] = 0.0016686828392500003;
    local_1a8[10] = 0.0030726129075;
    local_1a8[0xb] = 0.00034398350740000034;
    local_1a8[0xc] = 0.0006661732772499996;
    local_1a8[0xd] = 0.0007601921039999995;
    local_1a8[0xe] = 0.0015323131260000008;
    local_1a8[0xf] = 0.0022796327649999997;
    local_1a8[0x10] = 0.0027535931289999994;
    local_1a8[0x11] = 0.0032581048315000038;
    local_1a8[0x12] = 0.0039887186525;
    local_1a8[0x13] = 0.00037292862650000006;
    local_1a8[0x14] = 0.0;
    local_d8 = 1.9101473600491665;
    dVar186 = 2.079423123570834;
    dVar221 = 1.0030833333333333;
    dVar155 = 17.914627724425;
    dVar50 = 2.874817692333335;
    dVar49 = 7.078776559375;
    dVar51 = 11.395261584404166;
    uVar181 = 0x3b81a1b0;
    uVar183 = 0x401afa1c;
    uVar182 = 0x2ff0e67f;
    uVar184 = 0xc010e896;
    dVar52 = -6.748131844745;
    dVar120 = -27.605086887896665;
    dVar156 = 16.114317783399166;
    dVar253 = -0.5650564362916671;
    dVar283 = 34.602608086557915;
    dVar292 = 37.543891960460414;
    dVar53 = -16.524086927680834;
    dVar185 = 4.3818731557687505;
    uVar245 = 0x919c8014;
    uVar246 = 0x40020b57;
    uVar247 = 0xd3fd44c6;
    uVar248 = 0x40146fd4;
    uVar249 = 0x2efd9734;
    uVar250 = 0x40327b81;
    uVar251 = 0xaf13a7dd;
    uVar252 = 0x403501f0;
    pdVar35 = local_d0;
    pdVar37 = local_c0;
    pdVar38 = local_b0;
    pdVar42 = local_a0;
    pdVar44 = local_90;
    pdVar46 = local_80;
    pdVar47 = local_70;
    pdVar48 = local_60;
    local_268 = local_278;
    local_270 = local_280;
  }
  else {
    local_258[0] = 3.8822959451999997;
    local_258[1] = 2.4999999982659773;
    local_258[2] = 2.507252090419375;
    local_258[3] = 4.398993884662499;
    local_258[4] = 3.9627907472;
    local_258[5] = 5.687841430575;
    local_258[6] = 6.28216306040625;
    local_258[7] = 5.971630974581251;
    local_258[8] = 5.98750050771875;
    local_258[9] = 8.1984342065375;
    local_258[10] = 10.874274296874997;
    local_258[0xb] = 4.234951016024999;
    local_258[0xc] = 7.023470866475001;
    local_258[0xd] = 6.33591319330625;
    local_258[0xe] = 8.55905700475;
    local_258[0xf] = 10.825474777499998;
    local_258[0x10] = 13.237367439937499;
    local_258[0x11] = 15.24695121525;
    local_258[0x12] = 17.552933378125;
    local_258[0x13] = 4.1861203930625;
    local_258[0x14] = 2.5;
    local_1a8[0] = 0.000507239459;
    dVar186 = 0.00037292862650000006;
    dVar221 = 0.0;
    dVar155 = 0.0032581048315000038;
    dVar50 = 0.0039887186525;
    dVar49 = 0.0022796327649999997;
    dVar51 = 0.0027535931289999994;
    uVar181 = 0x1cd88321;
    uVar183 = 0x3f48e8f4;
    uVar182 = 0xb0db9218;
    uVar184 = 0x3f591afc;
    dVar52 = 0.00034398350740000034;
    dVar120 = 0.0006661732772499996;
    dVar156 = 0.0016686828392500003;
    dVar253 = 0.0030726129075;
    dVar283 = 0.0009323347502999997;
    dVar292 = 0.0009823763672500007;
    dVar53 = 0.0012567384129500002;
    dVar185 = 0.0009643321552500001;
    uVar245 = 0xe8e87ee7;
    uVar246 = 0x3f35a99e;
    uVar247 = 0x598d8058;
    uVar248 = 0x3f402609;
    uVar249 = 0x91b4691f;
    uVar250 = 0x3d44c87a;
    uVar251 = 0x42942cb3;
    uVar252 = 0xbee76acf;
    pdVar45 = &local_1368;
    pdVar35 = local_1a8 + 1;
    pdVar37 = local_1a8 + 3;
    pdVar38 = local_1a8 + 5;
    pdVar42 = local_1a8 + 7;
    pdVar44 = local_1a8 + 9;
    pdVar46 = local_1a8 + 0xb;
    pdVar47 = local_1a8 + 0xd;
    pdVar48 = local_1a8 + 0xf;
  }
  *(undefined4 *)pdVar35 = uVar249;
  *(undefined4 *)((long)pdVar35 + 4) = uVar250;
  *(undefined4 *)(pdVar35 + 1) = uVar251;
  *(undefined4 *)((long)pdVar35 + 0xc) = uVar252;
  *(undefined4 *)pdVar37 = uVar245;
  *(undefined4 *)((long)pdVar37 + 4) = uVar246;
  *(undefined4 *)(pdVar37 + 1) = uVar247;
  *(undefined4 *)((long)pdVar37 + 0xc) = uVar248;
  *pdVar38 = dVar53;
  pdVar38[1] = dVar185;
  *pdVar42 = dVar283;
  pdVar42[1] = dVar292;
  *pdVar44 = dVar156;
  pdVar44[1] = dVar253;
  *pdVar46 = dVar52;
  pdVar46[1] = dVar120;
  *(undefined4 *)pdVar47 = uVar181;
  *(undefined4 *)((long)pdVar47 + 4) = uVar183;
  *(undefined4 *)(pdVar47 + 1) = uVar182;
  *(undefined4 *)((long)pdVar47 + 0xc) = uVar184;
  *pdVar48 = dVar49;
  pdVar48[1] = dVar51;
  *local_268 = dVar155;
  local_268[1] = dVar50;
  *local_270 = dVar186;
  local_270[1] = dVar221;
  dVar185 = 0.0;
  dVar155 = 0.0;
  dVar53 = 0.0;
  lVar34 = 0;
  dVar50 = 0.0;
  do {
    dVar49 = *(double *)((long)adStack_15c0 + lVar34 + 8U);
    dVar50 = dVar50 + *(double *)((long)local_258 + lVar34) * dVar49;
    dVar51 = *(double *)((long)pdVar45 + lVar34);
    dVar185 = dVar185 + dVar49 * *(double *)((long)local_1a8 + lVar34);
    dVar155 = dVar155 + *(double *)((long)local_1508 + lVar34) * dVar51;
    dVar53 = dVar53 + (*(double *)((long)local_258 + lVar34) - dVar51) * 0.0006666666666666666 *
                      *(double *)((long)local_1508 + lVar34) +
                      dVar51 * *(double *)(local_410 + lVar34 + -8);
    lVar34 = lVar34 + 8;
  } while (lVar34 != 0xa8);
  dVar155 = dVar155 * (1.0 / dVar50);
  dVar49 = (1.0 / dVar50) * 1500.0;
  dVar50 = dVar155 * dVar49;
  dVar49 = -dVar49;
  lVar34 = 0;
  do {
    dVar51 = 0.0;
    lVar39 = 0;
    do {
      dVar51 = dVar51 + pdVar45[lVar39] * __s[lVar39];
      lVar39 = lVar39 + 1;
    } while (lVar39 != 0x15);
    adStack_11e0[lVar34 * 0x16] = local_258[lVar34] * dVar50 + dVar51 * dVar49;
    lVar34 = lVar34 + 1;
    __s = __s + 0x16;
  } while (lVar34 != 0x15);
  local_370 = dVar49 * dVar53 + (dVar50 * dVar185 - dVar155);
  if (local_33c == 1) {
    *rowPtrs = 1;
    if (0 < (int)uStack_1290._4_4_) {
      iVar36 = 1;
      uVar40 = 0;
      iVar43 = 1;
      do {
        lVar34 = 0;
        pdVar45 = local_1288;
        do {
          lVar39 = -0xf20;
          iVar41 = iVar36;
          do {
            dVar53 = *(double *)((long)pdVar45 + lVar39 + 0xf20);
            if ((dVar53 != 0.0) || (NAN(dVar53))) {
              colVals[(long)iVar43 + -1] = iVar41;
              iVar43 = iVar43 + 1;
            }
            iVar41 = iVar41 + 1;
            lVar39 = lVar39 + 0xb0;
          } while (lVar39 != 0);
          rowPtrs[uVar40 * 0x16 + lVar34 + 1] = iVar43;
          lVar34 = lVar34 + 1;
          pdVar45 = pdVar45 + 1;
        } while (lVar34 != 0x16);
        uVar40 = uVar40 + 1;
        iVar36 = iVar36 + 0x16;
      } while (uVar40 != uStack_1290._4_4_);
    }
  }
  else {
    *rowPtrs = 0;
    if (0 < (int)uStack_1290._4_4_) {
      iVar36 = 0;
      uVar40 = 0;
      iVar43 = 0;
      do {
        lVar34 = 0;
        pdVar45 = local_1288;
        do {
          lVar39 = -0xf20;
          iVar41 = iVar36;
          do {
            dVar53 = *(double *)((long)pdVar45 + lVar39 + 0xf20);
            if ((dVar53 != 0.0) || (NAN(dVar53))) {
              colVals[iVar43] = iVar41;
              iVar43 = iVar43 + 1;
            }
            iVar41 = iVar41 + 1;
            lVar39 = lVar39 + 0xb0;
          } while (lVar39 != 0);
          rowPtrs[uVar40 * 0x16 + lVar34 + 1] = iVar43;
          lVar34 = lVar34 + 1;
          pdVar45 = pdVar45 + 1;
        } while (lVar34 != 0x16);
        uVar40 = uVar40 + 1;
        iVar36 = iVar36 + 0x16;
      } while (uVar40 != uStack_1290._4_4_);
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_CSR(
  int* colVals, int* rowPtrs, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtrs[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtrs[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}